

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  code *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  long lVar79;
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [28];
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  ulong uVar97;
  LinearSpace3fa *pLVar98;
  Primitive *pPVar99;
  long lVar100;
  ulong uVar101;
  undefined4 uVar102;
  undefined8 uVar103;
  float fVar119;
  vint4 bi_2;
  undefined1 auVar104 [16];
  float fVar118;
  float fVar120;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar121;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar122;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar156 [16];
  undefined1 auVar160 [32];
  undefined1 auVar163 [64];
  vint4 ai;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar185;
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [64];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined4 uVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined4 uVar205;
  float fVar206;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_840 [16];
  undefined1 auStack_830 [16];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined1 local_790 [16];
  LinearSpace3fa *local_778;
  Precalculations *local_770;
  Primitive *local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 (*local_6a8) [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [8];
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [2] [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar101 = (ulong)(byte)PVar8;
  lVar79 = uVar101 * 0x19;
  fVar206 = *(float *)(prim + lVar79 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar13 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + lVar79 + 6));
  auVar104._0_4_ = fVar206 * auVar13._0_4_;
  auVar104._4_4_ = fVar206 * auVar13._4_4_;
  auVar104._8_4_ = fVar206 * auVar13._8_4_;
  auVar104._12_4_ = fVar206 * auVar13._12_4_;
  auVar174._0_4_ = fVar206 * auVar14._0_4_;
  auVar174._4_4_ = fVar206 * auVar14._4_4_;
  auVar174._8_4_ = fVar206 * auVar14._8_4_;
  auVar174._12_4_ = fVar206 * auVar14._12_4_;
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 6 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar101 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar101 + 6)));
  auVar159 = vcvtdq2ps_avx(auVar159);
  uVar95 = (ulong)(uint)((int)(uVar101 * 9) * 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + uVar101 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar95 = (ulong)(uint)((int)(uVar101 * 5) << 2);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar222._4_4_ = auVar174._0_4_;
  auVar222._0_4_ = auVar174._0_4_;
  auVar222._8_4_ = auVar174._0_4_;
  auVar222._12_4_ = auVar174._0_4_;
  auVar124 = vshufps_avx(auVar174,auVar174,0x55);
  auVar105 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar206 = auVar105._0_4_;
  auVar207._0_4_ = fVar206 * auVar16._0_4_;
  fVar118 = auVar105._4_4_;
  auVar207._4_4_ = fVar118 * auVar16._4_4_;
  fVar119 = auVar105._8_4_;
  auVar207._8_4_ = fVar119 * auVar16._8_4_;
  fVar120 = auVar105._12_4_;
  auVar207._12_4_ = fVar120 * auVar16._12_4_;
  auVar203._0_4_ = auVar159._0_4_ * fVar206;
  auVar203._4_4_ = auVar159._4_4_ * fVar118;
  auVar203._8_4_ = auVar159._8_4_ * fVar119;
  auVar203._12_4_ = auVar159._12_4_ * fVar120;
  auVar193._0_4_ = auVar143._0_4_ * fVar206;
  auVar193._4_4_ = auVar143._4_4_ * fVar118;
  auVar193._8_4_ = auVar143._8_4_ * fVar119;
  auVar193._12_4_ = auVar143._12_4_ * fVar120;
  auVar105 = vfmadd231ps_fma(auVar207,auVar124,auVar14);
  auVar125 = vfmadd231ps_fma(auVar203,auVar124,auVar18);
  auVar124 = vfmadd231ps_fma(auVar193,auVar106,auVar124);
  auVar156 = vfmadd231ps_fma(auVar105,auVar222,auVar13);
  auVar125 = vfmadd231ps_fma(auVar125,auVar222,auVar17);
  auVar165 = vfmadd231ps_fma(auVar124,auVar107,auVar222);
  auVar223._4_4_ = auVar104._0_4_;
  auVar223._0_4_ = auVar104._0_4_;
  auVar223._8_4_ = auVar104._0_4_;
  auVar223._12_4_ = auVar104._0_4_;
  auVar124 = vshufps_avx(auVar104,auVar104,0x55);
  auVar105 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar206 = auVar105._0_4_;
  auVar175._0_4_ = fVar206 * auVar16._0_4_;
  fVar118 = auVar105._4_4_;
  auVar175._4_4_ = fVar118 * auVar16._4_4_;
  fVar119 = auVar105._8_4_;
  auVar175._8_4_ = fVar119 * auVar16._8_4_;
  fVar120 = auVar105._12_4_;
  auVar175._12_4_ = fVar120 * auVar16._12_4_;
  auVar123._0_4_ = auVar159._0_4_ * fVar206;
  auVar123._4_4_ = auVar159._4_4_ * fVar118;
  auVar123._8_4_ = auVar159._8_4_ * fVar119;
  auVar123._12_4_ = auVar159._12_4_ * fVar120;
  auVar105._0_4_ = auVar143._0_4_ * fVar206;
  auVar105._4_4_ = auVar143._4_4_ * fVar118;
  auVar105._8_4_ = auVar143._8_4_ * fVar119;
  auVar105._12_4_ = auVar143._12_4_ * fVar120;
  auVar14 = vfmadd231ps_fma(auVar175,auVar124,auVar14);
  auVar16 = vfmadd231ps_fma(auVar123,auVar124,auVar18);
  auVar18 = vfmadd231ps_fma(auVar105,auVar124,auVar106);
  auVar159 = vfmadd231ps_fma(auVar14,auVar223,auVar13);
  auVar106 = vfmadd231ps_fma(auVar16,auVar223,auVar17);
  auVar143 = vfmadd231ps_fma(auVar18,auVar223,auVar107);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar156,local_2b0);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar164,1);
  auVar14 = vblendvps_avx(auVar156,auVar164,auVar13);
  auVar13 = vandps_avx(auVar125,local_2b0);
  auVar13 = vcmpps_avx(auVar13,auVar164,1);
  auVar16 = vblendvps_avx(auVar125,auVar164,auVar13);
  auVar13 = vandps_avx(auVar165,local_2b0);
  auVar13 = vcmpps_avx(auVar13,auVar164,1);
  auVar13 = vblendvps_avx(auVar165,auVar164,auVar13);
  auVar17 = vrcpps_avx(auVar14);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar17,auVar189);
  auVar17 = vfmadd132ps_fma(auVar14,auVar17,auVar17);
  auVar14 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar14,auVar189);
  auVar18 = vfmadd132ps_fma(auVar16,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar14,auVar189);
  auVar107 = vfmadd132ps_fma(auVar13,auVar14,auVar14);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar101 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar159);
  auVar165._0_4_ = auVar17._0_4_ * auVar13._0_4_;
  auVar165._4_4_ = auVar17._4_4_ * auVar13._4_4_;
  auVar165._8_4_ = auVar17._8_4_ * auVar13._8_4_;
  auVar165._12_4_ = auVar17._12_4_ * auVar13._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar101 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar14);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar159);
  auVar176._0_4_ = auVar17._0_4_ * auVar13._0_4_;
  auVar176._4_4_ = auVar17._4_4_ * auVar13._4_4_;
  auVar176._8_4_ = auVar17._8_4_ * auVar13._8_4_;
  auVar176._12_4_ = auVar17._12_4_ * auVar13._12_4_;
  auVar125._1_3_ = 0;
  auVar125[0] = PVar8;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar14 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar101 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar17);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar106);
  auVar194._0_4_ = auVar13._0_4_ * auVar18._0_4_;
  auVar194._4_4_ = auVar13._4_4_ * auVar18._4_4_;
  auVar194._8_4_ = auVar13._8_4_ * auVar18._8_4_;
  auVar194._12_4_ = auVar13._12_4_ * auVar18._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar14);
  auVar13 = vsubps_avx(auVar13,auVar106);
  auVar124._0_4_ = auVar18._0_4_ * auVar13._0_4_;
  auVar124._4_4_ = auVar18._4_4_ * auVar13._4_4_;
  auVar124._8_4_ = auVar18._8_4_ * auVar13._8_4_;
  auVar124._12_4_ = auVar18._12_4_ * auVar13._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar95 + uVar101 + 6);
  auVar13 = vpmovsxwd_avx(auVar18);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar143);
  auVar156._0_4_ = auVar107._0_4_ * auVar13._0_4_;
  auVar156._4_4_ = auVar107._4_4_ * auVar13._4_4_;
  auVar156._8_4_ = auVar107._8_4_ * auVar13._8_4_;
  auVar156._12_4_ = auVar107._12_4_ * auVar13._12_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar101 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar159);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar143);
  auVar106._0_4_ = auVar107._0_4_ * auVar13._0_4_;
  auVar106._4_4_ = auVar107._4_4_ * auVar13._4_4_;
  auVar106._8_4_ = auVar107._8_4_ * auVar13._8_4_;
  auVar106._12_4_ = auVar107._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar165,auVar176);
  auVar14 = vpminsd_avx(auVar194,auVar124);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar14 = vpminsd_avx(auVar156,auVar106);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar198._4_4_ = uVar4;
  auVar198._0_4_ = uVar4;
  auVar198._8_4_ = uVar4;
  auVar198._12_4_ = uVar4;
  auVar14 = vmaxps_avx(auVar14,auVar198);
  auVar13 = vmaxps_avx(auVar13,auVar14);
  local_2c0._0_4_ = auVar13._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar13._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar13._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar165,auVar176);
  auVar14 = vpmaxsd_avx(auVar194,auVar124);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar14 = vpmaxsd_avx(auVar156,auVar106);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar143._4_4_ = uVar4;
  auVar143._0_4_ = uVar4;
  auVar143._8_4_ = uVar4;
  auVar143._12_4_ = uVar4;
  auVar14 = vminps_avx(auVar14,auVar143);
  auVar13 = vminps_avx(auVar13,auVar14);
  auVar107._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar125[4] = PVar8;
  auVar125._5_3_ = 0;
  auVar125[8] = PVar8;
  auVar125._9_3_ = 0;
  auVar125[0xc] = PVar8;
  auVar125._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar125,_DAT_01f7fcf0);
  auVar13 = vcmpps_avx(local_2c0,auVar107,2);
  auVar13 = vandps_avx(auVar13,auVar14);
  uVar96 = vmovmskps_avx(auVar13);
  if (uVar96 != 0) {
    uVar96 = uVar96 & 0xff;
    local_5a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_5a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_5a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    pLVar98 = pre->ray_space + k;
    local_6a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    pPVar99 = prim;
    local_778 = pLVar98;
    local_770 = pre;
    local_768 = prim;
    do {
      lVar24 = 0;
      uVar101 = (ulong)uVar96;
      for (uVar95 = uVar101; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar101 = uVar101 - 1 & uVar101;
      uVar4 = *(undefined4 *)(pPVar99 + lVar24 * 4 + 6);
      uVar95 = (ulong)(uint)((int)lVar24 << 6);
      local_7e0._4_4_ = *(undefined4 *)(pPVar99 + 2);
      pGVar10 = (context->scene->geometries).items[(uint)local_7e0._4_4_].ptr;
      pPVar1 = prim + uVar95 + lVar79 + 0x16;
      uVar90 = *(undefined8 *)pPVar1;
      uVar91 = *(undefined8 *)(pPVar1 + 8);
      auVar16 = *(undefined1 (*) [16])pPVar1;
      auVar14 = *(undefined1 (*) [16])pPVar1;
      auVar13 = *(undefined1 (*) [16])pPVar1;
      if (uVar101 != 0) {
        uVar97 = uVar101 - 1 & uVar101;
        for (uVar25 = uVar101; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar17 = *(undefined1 (*) [16])(prim + uVar95 + lVar79 + 0x26);
      auVar18 = *(undefined1 (*) [16])(prim + uVar95 + lVar79 + 0x36);
      auVar159 = *(undefined1 (*) [16])(prim + uVar95 + lVar79 + 0x46);
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar124 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar106 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar124);
      uVar102 = auVar106._0_4_;
      auVar166._4_4_ = uVar102;
      auVar166._0_4_ = uVar102;
      auVar166._8_4_ = uVar102;
      auVar166._12_4_ = uVar102;
      auVar107 = vshufps_avx(auVar106,auVar106,0x55);
      auVar106 = vshufps_avx(auVar106,auVar106,0xaa);
      aVar5 = (pLVar98->vx).field_0;
      aVar6 = (pLVar98->vy).field_0;
      fVar206 = (pLVar98->vz).field_0.m128[0];
      fVar118 = *(float *)((long)&(pLVar98->vz).field_0 + 4);
      fVar119 = *(float *)((long)&(pLVar98->vz).field_0 + 8);
      fVar120 = *(float *)((long)&(pLVar98->vz).field_0 + 0xc);
      auVar186._0_4_ = fVar206 * auVar106._0_4_;
      auVar186._4_4_ = fVar118 * auVar106._4_4_;
      auVar186._8_4_ = fVar119 * auVar106._8_4_;
      auVar186._12_4_ = fVar120 * auVar106._12_4_;
      auVar107 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar6,auVar107);
      auVar125 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar5,auVar166);
      auVar107 = vblendps_avx(auVar125,*(undefined1 (*) [16])pPVar1,8);
      auVar143 = vsubps_avx(auVar17,auVar124);
      uVar102 = auVar143._0_4_;
      auVar187._4_4_ = uVar102;
      auVar187._0_4_ = uVar102;
      auVar187._8_4_ = uVar102;
      auVar187._12_4_ = uVar102;
      auVar106 = vshufps_avx(auVar143,auVar143,0x55);
      auVar143 = vshufps_avx(auVar143,auVar143,0xaa);
      auVar199._0_4_ = fVar206 * auVar143._0_4_;
      auVar199._4_4_ = fVar118 * auVar143._4_4_;
      auVar199._8_4_ = fVar119 * auVar143._8_4_;
      auVar199._12_4_ = fVar120 * auVar143._12_4_;
      auVar106 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar6,auVar106);
      auVar156 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar187);
      auVar106 = vblendps_avx(auVar156,auVar17,8);
      auVar105 = vsubps_avx(auVar18,auVar124);
      uVar102 = auVar105._0_4_;
      auVar190._4_4_ = uVar102;
      auVar190._0_4_ = uVar102;
      auVar190._8_4_ = uVar102;
      auVar190._12_4_ = uVar102;
      auVar143 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar208._0_4_ = fVar206 * auVar105._0_4_;
      auVar208._4_4_ = fVar118 * auVar105._4_4_;
      auVar208._8_4_ = fVar119 * auVar105._8_4_;
      auVar208._12_4_ = fVar120 * auVar105._12_4_;
      auVar143 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar6,auVar143);
      auVar165 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar5,auVar190);
      auVar143 = vblendps_avx(auVar165,auVar18,8);
      auVar105 = vsubps_avx(auVar159,auVar124);
      uVar102 = auVar105._0_4_;
      auVar191._4_4_ = uVar102;
      auVar191._0_4_ = uVar102;
      auVar191._8_4_ = uVar102;
      auVar191._12_4_ = uVar102;
      auVar124 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar218._0_4_ = fVar206 * auVar105._0_4_;
      auVar218._4_4_ = fVar118 * auVar105._4_4_;
      auVar218._8_4_ = fVar119 * auVar105._8_4_;
      auVar218._12_4_ = fVar120 * auVar105._12_4_;
      auVar124 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar6,auVar124);
      auVar104 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar5,auVar191);
      auVar124 = vblendps_avx(auVar104,auVar159,8);
      auVar107 = vandps_avx(auVar107,local_2b0);
      auVar106 = vandps_avx(auVar106,local_2b0);
      auVar105 = vmaxps_avx(auVar107,auVar106);
      auVar107 = vandps_avx(auVar143,local_2b0);
      auVar106 = vandps_avx(auVar124,local_2b0);
      auVar107 = vmaxps_avx(auVar107,auVar106);
      auVar107 = vmaxps_avx(auVar105,auVar107);
      auVar106 = vmovshdup_avx(auVar107);
      auVar106 = vmaxss_avx(auVar106,auVar107);
      auVar107 = vshufpd_avx(auVar107,auVar107,1);
      auVar107 = vmaxss_avx(auVar107,auVar106);
      lVar24 = (long)iVar9 * 0x44;
      auVar106 = vmovshdup_avx(auVar125);
      uVar103 = auVar106._0_8_;
      local_480._8_8_ = uVar103;
      local_480._0_8_ = uVar103;
      local_480._16_8_ = uVar103;
      local_480._24_8_ = uVar103;
      auVar106 = vmovshdup_avx(auVar156);
      uVar103 = auVar106._0_8_;
      local_4a0._8_8_ = uVar103;
      local_4a0._0_8_ = uVar103;
      local_4a0._16_8_ = uVar103;
      local_4a0._24_8_ = uVar103;
      auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x908);
      uVar205 = auVar165._0_4_;
      local_660._4_4_ = uVar205;
      local_660._0_4_ = uVar205;
      local_660._8_4_ = uVar205;
      local_660._12_4_ = uVar205;
      local_660._16_4_ = uVar205;
      local_660._20_4_ = uVar205;
      local_660._24_4_ = uVar205;
      local_660._28_4_ = uVar205;
      auVar106 = vmovshdup_avx(auVar165);
      uVar103 = auVar106._0_8_;
      local_5c0._8_8_ = uVar103;
      local_5c0._0_8_ = uVar103;
      local_5c0._16_8_ = uVar103;
      local_5c0._24_8_ = uVar103;
      fVar206 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      auVar93 = *(undefined1 (*) [28])(bezier_basis0 + lVar24 + 0xd8c);
      local_460 = auVar104._0_4_;
      auVar106 = vmovshdup_avx(auVar104);
      local_140 = auVar106._0_8_;
      auVar169._4_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xd90);
      auVar169._0_4_ = local_460 * fVar206;
      auVar169._8_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar169._12_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xd98);
      auVar169._16_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xd9c);
      auVar169._20_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xda0);
      auVar169._24_4_ = local_460 * *(float *)(bezier_basis0 + lVar24 + 0xda4);
      auVar169._28_4_ = *(undefined4 *)(bezier_basis0 + lVar24 + 0xda8);
      auVar143 = vfmadd231ps_fma(auVar169,auVar136,local_660);
      fVar173 = auVar106._0_4_;
      auVar221._0_4_ = fVar173 * fVar206;
      fVar185 = auVar106._4_4_;
      auVar221._4_4_ = fVar185 * *(float *)(bezier_basis0 + lVar24 + 0xd90);
      auVar221._8_4_ = fVar173 * *(float *)(bezier_basis0 + lVar24 + 0xd94);
      auVar221._12_4_ = fVar185 * *(float *)(bezier_basis0 + lVar24 + 0xd98);
      auVar221._16_4_ = fVar173 * *(float *)(bezier_basis0 + lVar24 + 0xd9c);
      auVar221._20_4_ = fVar185 * *(float *)(bezier_basis0 + lVar24 + 0xda0);
      auVar221._24_4_ = fVar173 * *(float *)(bezier_basis0 + lVar24 + 0xda4);
      auVar221._28_4_ = 0;
      auVar106 = vfmadd231ps_fma(auVar221,auVar136,local_5c0);
      auVar169 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x484);
      uVar197 = auVar156._0_4_;
      local_740._4_4_ = uVar197;
      local_740._0_4_ = uVar197;
      local_740._8_4_ = uVar197;
      local_740._12_4_ = uVar197;
      local_740._16_4_ = uVar197;
      local_740._20_4_ = uVar197;
      local_740._24_4_ = uVar197;
      local_740._28_4_ = uVar197;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar169,local_740);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar169,local_4a0);
      auVar221 = *(undefined1 (*) [32])(bezier_basis0 + lVar24);
      uVar102 = auVar125._0_4_;
      local_760._4_4_ = uVar102;
      local_760._0_4_ = uVar102;
      local_760._8_4_ = uVar102;
      local_760._12_4_ = uVar102;
      local_760._16_4_ = uVar102;
      local_760._20_4_ = uVar102;
      local_760._24_4_ = uVar102;
      local_760._28_4_ = uVar102;
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar221,local_760);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar221,local_480);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x908);
      fVar214 = *(float *)(bezier_basis1 + lVar24 + 0xd8c);
      fVar215 = *(float *)(bezier_basis1 + lVar24 + 0xd90);
      fVar216 = *(float *)(bezier_basis1 + lVar24 + 0xd94);
      fVar217 = *(float *)(bezier_basis1 + lVar24 + 0xd98);
      fVar121 = *(float *)(bezier_basis1 + lVar24 + 0xd9c);
      fVar81 = *(float *)(bezier_basis1 + lVar24 + 0xda0);
      fVar82 = *(float *)(bezier_basis1 + lVar24 + 0xda4);
      auVar133._4_4_ = local_460 * fVar215;
      auVar133._0_4_ = local_460 * fVar214;
      auVar133._8_4_ = local_460 * fVar216;
      auVar133._12_4_ = local_460 * fVar217;
      auVar133._16_4_ = local_460 * fVar121;
      auVar133._20_4_ = local_460 * fVar81;
      auVar133._24_4_ = local_460 * fVar82;
      auVar133._28_4_ = *(undefined4 *)(bezier_basis0 + lVar24 + 0xda8);
      auVar124 = vfmadd231ps_fma(auVar133,auVar115,local_660);
      uStack_138 = local_140;
      uStack_130 = local_140;
      uStack_128 = local_140;
      auVar7._4_4_ = fVar215 * fVar185;
      auVar7._0_4_ = fVar214 * fVar173;
      auVar7._8_4_ = fVar216 * fVar173;
      auVar7._12_4_ = fVar217 * fVar185;
      auVar7._16_4_ = fVar121 * fVar173;
      auVar7._20_4_ = fVar81 * fVar185;
      auVar7._24_4_ = fVar82 * fVar173;
      auVar7._28_4_ = uVar205;
      auVar105 = vfmadd231ps_fma(auVar7,auVar115,local_5c0);
      auVar133 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x484);
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar133,local_740);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar133,local_4a0);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar24);
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar7,local_760);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,local_480);
      local_300 = ZEXT1632(auVar124);
      auVar128 = ZEXT1632(auVar143);
      local_4c0 = vsubps_avx(local_300,auVar128);
      _local_500 = ZEXT1632(auVar105);
      local_320 = ZEXT1632(auVar106);
      local_340 = vsubps_avx(_local_500,local_320);
      auVar109._0_4_ = auVar106._0_4_ * local_4c0._0_4_;
      auVar109._4_4_ = auVar106._4_4_ * local_4c0._4_4_;
      auVar109._8_4_ = auVar106._8_4_ * local_4c0._8_4_;
      auVar109._12_4_ = auVar106._12_4_ * local_4c0._12_4_;
      auVar109._16_4_ = local_4c0._16_4_ * 0.0;
      auVar109._20_4_ = local_4c0._20_4_ * 0.0;
      auVar109._24_4_ = local_4c0._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      fVar206 = local_340._0_4_;
      auVar129._0_4_ = auVar143._0_4_ * fVar206;
      fVar118 = local_340._4_4_;
      auVar129._4_4_ = auVar143._4_4_ * fVar118;
      fVar119 = local_340._8_4_;
      auVar129._8_4_ = auVar143._8_4_ * fVar119;
      fVar120 = local_340._12_4_;
      auVar129._12_4_ = auVar143._12_4_ * fVar120;
      fVar15 = local_340._16_4_;
      auVar129._16_4_ = fVar15 * 0.0;
      fVar212 = local_340._20_4_;
      auVar129._20_4_ = fVar212 * 0.0;
      fVar213 = local_340._24_4_;
      auVar129._24_4_ = fVar213 * 0.0;
      auVar129._28_4_ = 0;
      auVar109 = vsubps_avx(auVar109,auVar129);
      auVar106 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar103 = auVar106._0_8_;
      local_80._8_8_ = uVar103;
      local_80._0_8_ = uVar103;
      local_80._16_8_ = uVar103;
      local_80._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar17,0xff);
      uVar103 = auVar143._0_8_;
      local_a0._8_8_ = uVar103;
      local_a0._0_8_ = uVar103;
      local_a0._16_8_ = uVar103;
      local_a0._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar18,0xff);
      uVar103 = auVar143._0_8_;
      local_c0._8_8_ = uVar103;
      local_c0._0_8_ = uVar103;
      local_c0._16_8_ = uVar103;
      local_c0._24_8_ = uVar103;
      auVar143 = vpermilps_avx(auVar159,0xff);
      local_e0 = auVar143._0_8_;
      local_800 = auVar93._0_4_;
      fStack_7fc = auVar93._4_4_;
      fStack_7f8 = auVar93._8_4_;
      fStack_7f4 = auVar93._12_4_;
      fStack_7f0 = auVar93._16_4_;
      fStack_7ec = auVar93._20_4_;
      fStack_7e8 = auVar93._24_4_;
      fVar122 = auVar143._0_4_;
      fVar142 = auVar143._4_4_;
      auVar195._4_4_ = fVar142 * fStack_7fc;
      auVar195._0_4_ = fVar122 * local_800;
      auVar195._8_4_ = fVar122 * fStack_7f8;
      auVar195._12_4_ = fVar142 * fStack_7f4;
      auVar195._16_4_ = fVar122 * fStack_7f0;
      auVar195._20_4_ = fVar142 * fStack_7ec;
      auVar195._24_4_ = fVar122 * fStack_7e8;
      auVar195._28_4_ = uVar197;
      auVar143 = vfmadd231ps_fma(auVar195,local_c0,auVar136);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar169,local_a0);
      auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar221,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar22._4_4_ = fVar215 * fVar142;
      auVar22._0_4_ = fVar214 * fVar122;
      auVar22._8_4_ = fVar216 * fVar122;
      auVar22._12_4_ = fVar217 * fVar142;
      auVar22._16_4_ = fVar121 * fVar122;
      auVar22._20_4_ = fVar81 * fVar142;
      auVar22._24_4_ = fVar82 * fVar122;
      auVar22._28_4_ = fVar142;
      auVar124 = vfmadd231ps_fma(auVar22,auVar115,local_c0);
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar133,local_a0);
      auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar7,local_80);
      auVar154._4_4_ = fVar118 * fVar118;
      auVar154._0_4_ = fVar206 * fVar206;
      auVar154._8_4_ = fVar119 * fVar119;
      auVar154._12_4_ = fVar120 * fVar120;
      auVar154._16_4_ = fVar15 * fVar15;
      auVar154._20_4_ = fVar212 * fVar212;
      auVar154._24_4_ = fVar213 * fVar213;
      auVar154._28_4_ = auVar106._4_4_;
      auVar106 = vfmadd231ps_fma(auVar154,local_4c0,local_4c0);
      auVar154 = ZEXT1632(auVar124);
      auVar195 = vmaxps_avx(ZEXT1632(auVar143),auVar154);
      auVar23._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar106._4_4_;
      auVar23._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar106._0_4_;
      auVar23._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar106._8_4_;
      auVar23._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar106._12_4_;
      auVar23._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
      auVar23._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
      auVar23._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
      auVar23._28_4_ = auVar195._28_4_;
      auVar21._4_4_ = auVar109._4_4_ * auVar109._4_4_;
      auVar21._0_4_ = auVar109._0_4_ * auVar109._0_4_;
      auVar21._8_4_ = auVar109._8_4_ * auVar109._8_4_;
      auVar21._12_4_ = auVar109._12_4_ * auVar109._12_4_;
      auVar21._16_4_ = auVar109._16_4_ * auVar109._16_4_;
      auVar21._20_4_ = auVar109._20_4_ * auVar109._20_4_;
      auVar21._24_4_ = auVar109._24_4_ * auVar109._24_4_;
      auVar21._28_4_ = 0;
      auVar195 = vcmpps_avx(auVar21,auVar23,2);
      fVar206 = auVar107._0_4_ * 4.7683716e-07;
      auVar110._0_4_ = (float)iVar9;
      register0x00001504 = auVar104._4_12_;
      auVar110._4_4_ = auVar110._0_4_;
      auVar110._8_4_ = auVar110._0_4_;
      auVar110._12_4_ = auVar110._0_4_;
      auVar110._16_4_ = auVar110._0_4_;
      auVar110._20_4_ = auVar110._0_4_;
      auVar110._24_4_ = auVar110._0_4_;
      auVar110._28_4_ = auVar110._0_4_;
      auVar109 = vcmpps_avx(_DAT_01faff40,auVar110,1);
      auVar107 = vpermilps_avx(auVar125,0xaa);
      uVar103 = auVar107._0_8_;
      auVar160._8_8_ = uVar103;
      auVar160._0_8_ = uVar103;
      auVar160._16_8_ = uVar103;
      auVar160._24_8_ = uVar103;
      auVar107 = vpermilps_avx(auVar156,0xaa);
      uVar103 = auVar107._0_8_;
      local_680._8_8_ = uVar103;
      local_680._0_8_ = uVar103;
      local_680._16_8_ = uVar103;
      local_680._24_8_ = uVar103;
      auVar106 = vpermilps_avx(auVar165,0xaa);
      uVar103 = auVar106._0_8_;
      auVar204._8_8_ = uVar103;
      auVar204._0_8_ = uVar103;
      auVar204._16_8_ = uVar103;
      auVar204._24_8_ = uVar103;
      auVar107 = vshufps_avx(auVar104,auVar104,0xaa);
      uVar103 = auVar107._0_8_;
      register0x00001508 = uVar103;
      local_620 = uVar103;
      register0x00001510 = uVar103;
      register0x00001518 = uVar103;
      auVar220 = ZEXT3264(_local_620);
      auVar22 = auVar109 & auVar195;
      uVar96 = *(uint *)(ray + k * 4 + 0x30);
      local_600._0_16_ = ZEXT416(uVar96);
      local_7a0 = auVar17._0_8_;
      uStack_798 = auVar17._8_8_;
      local_7b0 = auVar18._0_8_;
      uStack_7a8 = auVar18._8_8_;
      local_7c0._0_4_ = auVar159._0_4_;
      fVar118 = (float)local_7c0;
      local_7c0._4_4_ = auVar159._4_4_;
      fVar119 = local_7c0._4_4_;
      uStack_7b8._0_4_ = auVar159._8_4_;
      fVar120 = (float)uStack_7b8;
      uStack_7b8._4_4_ = auVar159._12_4_;
      fVar15 = uStack_7b8._4_4_;
      local_7c0 = auVar159._0_8_;
      uStack_7b8 = auVar159._8_8_;
      fStack_45c = local_460;
      fStack_458 = local_460;
      fStack_454 = local_460;
      fStack_450 = local_460;
      fStack_44c = local_460;
      fStack_448 = local_460;
      fStack_444 = local_460;
      local_630._0_4_ = auVar110._0_4_;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar22 >> 0x7f,0) == '\0') &&
            (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar22 >> 0xbf,0) == '\0') &&
          (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar22[0x1f])
      {
        auVar210 = ZEXT3264(local_680);
        auVar141 = ZEXT3264(local_660);
        auVar163 = ZEXT3264(local_5c0);
        auVar192 = ZEXT3264(local_740);
        auVar226 = ZEXT3264(local_760);
      }
      else {
        local_560 = SUB84(pGVar10,0);
        uStack_55c = (undefined4)((ulong)pGVar10 >> 0x20);
        _local_360 = vandps_avx(auVar195,auVar109);
        fVar122 = auVar107._0_4_;
        fVar142 = auVar107._4_4_;
        auVar19._4_4_ = fVar142 * fVar215;
        auVar19._0_4_ = fVar122 * fVar214;
        auVar19._8_4_ = fVar122 * fVar216;
        auVar19._12_4_ = fVar142 * fVar217;
        auVar19._16_4_ = fVar122 * fVar121;
        auVar19._20_4_ = fVar142 * fVar81;
        auVar19._24_4_ = fVar122 * fVar82;
        auVar19._28_4_ = local_360._28_4_;
        auVar159 = vfmadd213ps_fma(auVar115,auVar204,auVar19);
        auVar159 = vfmadd213ps_fma(auVar133,local_680,ZEXT1632(auVar159));
        auVar159 = vfmadd213ps_fma(auVar7,auVar160,ZEXT1632(auVar159));
        auVar111._0_4_ = fVar122 * local_800;
        auVar111._4_4_ = fVar142 * fStack_7fc;
        auVar111._8_4_ = fVar122 * fStack_7f8;
        auVar111._12_4_ = fVar142 * fStack_7f4;
        auVar111._16_4_ = fVar122 * fStack_7f0;
        auVar111._20_4_ = fVar142 * fStack_7ec;
        auVar111._24_4_ = fVar122 * fStack_7e8;
        auVar111._28_4_ = 0;
        auVar107 = vfmadd213ps_fma(auVar136,auVar204,auVar111);
        auVar107 = vfmadd213ps_fma(auVar169,local_680,ZEXT1632(auVar107));
        auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1694);
        auVar133 = *(undefined1 (*) [32])(bezier_basis0 + lVar24 + 0x1b18);
        fVar212 = *(float *)(bezier_basis0 + lVar24 + 0x1f9c);
        fVar213 = *(float *)(bezier_basis0 + lVar24 + 0x1fa0);
        fVar214 = *(float *)(bezier_basis0 + lVar24 + 0x1fa4);
        fVar215 = *(float *)(bezier_basis0 + lVar24 + 0x1fa8);
        fVar216 = *(float *)(bezier_basis0 + lVar24 + 0x1fac);
        fVar217 = *(float *)(bezier_basis0 + lVar24 + 0x1fb0);
        fVar121 = *(float *)(bezier_basis0 + lVar24 + 0x1fb4);
        auVar181._0_4_ = local_460 * fVar212;
        auVar181._4_4_ = local_460 * fVar213;
        auVar181._8_4_ = local_460 * fVar214;
        auVar181._12_4_ = local_460 * fVar215;
        auVar181._16_4_ = local_460 * fVar216;
        auVar181._20_4_ = local_460 * fVar217;
        auVar181._24_4_ = local_460 * fVar121;
        auVar181._28_4_ = 0;
        auVar20._4_4_ = fVar185 * fVar213;
        auVar20._0_4_ = fVar173 * fVar212;
        auVar20._8_4_ = fVar173 * fVar214;
        auVar20._12_4_ = fVar185 * fVar215;
        auVar20._16_4_ = fVar173 * fVar216;
        auVar20._20_4_ = fVar185 * fVar217;
        auVar20._24_4_ = fVar173 * fVar121;
        auVar20._28_4_ = auVar169._28_4_;
        auVar170._4_4_ = fVar213 * fVar142;
        auVar170._0_4_ = fVar212 * fVar122;
        auVar170._8_4_ = fVar214 * fVar122;
        auVar170._12_4_ = fVar215 * fVar142;
        auVar170._16_4_ = fVar216 * fVar122;
        auVar170._20_4_ = fVar217 * fVar142;
        auVar170._24_4_ = fVar121 * fVar122;
        auVar170._28_4_ = auVar106._4_4_;
        auVar106 = vfmadd231ps_fma(auVar181,auVar133,local_660);
        auVar124 = vfmadd231ps_fma(auVar20,auVar133,local_5c0);
        auVar105 = vfmadd231ps_fma(auVar170,auVar204,auVar133);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar115,local_740);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar115,local_4a0);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_680,auVar115);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar136,local_760);
        auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar136,local_480);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar136,auVar160);
        fVar212 = *(float *)(bezier_basis1 + lVar24 + 0x1f9c);
        fVar213 = *(float *)(bezier_basis1 + lVar24 + 0x1fa0);
        fVar214 = *(float *)(bezier_basis1 + lVar24 + 0x1fa4);
        fVar215 = *(float *)(bezier_basis1 + lVar24 + 0x1fa8);
        fVar216 = *(float *)(bezier_basis1 + lVar24 + 0x1fac);
        fVar217 = *(float *)(bezier_basis1 + lVar24 + 0x1fb0);
        fVar121 = *(float *)(bezier_basis1 + lVar24 + 0x1fb4);
        auVar115._4_4_ = local_460 * fVar213;
        auVar115._0_4_ = local_460 * fVar212;
        auVar115._8_4_ = local_460 * fVar214;
        auVar115._12_4_ = local_460 * fVar215;
        auVar115._16_4_ = local_460 * fVar216;
        auVar115._20_4_ = local_460 * fVar217;
        auVar115._24_4_ = local_460 * fVar121;
        auVar115._28_4_ = local_460;
        auVar26._4_4_ = fVar185 * fVar213;
        auVar26._0_4_ = fVar173 * fVar212;
        auVar26._8_4_ = fVar173 * fVar214;
        auVar26._12_4_ = fVar185 * fVar215;
        auVar26._16_4_ = fVar173 * fVar216;
        auVar26._20_4_ = fVar185 * fVar217;
        auVar26._24_4_ = fVar173 * fVar121;
        auVar26._28_4_ = fVar185;
        auVar27._4_4_ = fVar142 * fVar213;
        auVar27._0_4_ = fVar122 * fVar212;
        auVar27._8_4_ = fVar122 * fVar214;
        auVar27._12_4_ = fVar142 * fVar215;
        auVar27._16_4_ = fVar122 * fVar216;
        auVar27._20_4_ = fVar142 * fVar217;
        auVar27._24_4_ = fVar122 * fVar121;
        auVar27._28_4_ = fVar142;
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1b18);
        auVar125 = vfmadd231ps_fma(auVar115,auVar136,local_660);
        auVar156 = vfmadd231ps_fma(auVar26,auVar136,local_5c0);
        auVar165 = vfmadd231ps_fma(auVar27,auVar204,auVar136);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1694);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar136,local_740);
        auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar136,local_4a0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_680,auVar136);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar24 + 0x1210);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar136,local_760);
        auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar136,local_480);
        auVar130._8_4_ = 0x7fffffff;
        auVar130._0_8_ = 0x7fffffff7fffffff;
        auVar130._12_4_ = 0x7fffffff;
        auVar130._16_4_ = 0x7fffffff;
        auVar130._20_4_ = 0x7fffffff;
        auVar130._24_4_ = 0x7fffffff;
        auVar130._28_4_ = 0x7fffffff;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar160,auVar136);
        auVar136 = vandps_avx(ZEXT1632(auVar106),auVar130);
        auVar169 = vandps_avx(ZEXT1632(auVar124),auVar130);
        auVar169 = vmaxps_avx(auVar136,auVar169);
        auVar136 = vandps_avx(ZEXT1632(auVar105),auVar130);
        auVar136 = vmaxps_avx(auVar169,auVar136);
        auVar152._4_4_ = fVar206;
        auVar152._0_4_ = fVar206;
        auVar152._8_4_ = fVar206;
        auVar152._12_4_ = fVar206;
        auVar152._16_4_ = fVar206;
        auVar152._20_4_ = fVar206;
        auVar152._24_4_ = fVar206;
        auVar152._28_4_ = fVar206;
        auVar136 = vcmpps_avx(auVar136,auVar152,1);
        auVar115 = vblendvps_avx(ZEXT1632(auVar106),local_4c0,auVar136);
        auVar133 = vblendvps_avx(ZEXT1632(auVar124),local_340,auVar136);
        auVar136 = vandps_avx(ZEXT1632(auVar125),auVar130);
        auVar169 = vandps_avx(ZEXT1632(auVar156),auVar130);
        auVar7 = vmaxps_avx(auVar136,auVar169);
        auVar136 = vandps_avx(ZEXT1632(auVar165),auVar130);
        auVar136 = vmaxps_avx(auVar7,auVar136);
        auVar195 = vcmpps_avx(auVar136,auVar152,1);
        auVar136 = vblendvps_avx(ZEXT1632(auVar125),local_4c0,auVar195);
        auVar7 = vblendvps_avx(ZEXT1632(auVar156),local_340,auVar195);
        auVar107 = vfmadd213ps_fma(auVar221,auVar160,ZEXT1632(auVar107));
        auVar106 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar133,auVar133);
        auVar221 = vrsqrtps_avx(ZEXT1632(auVar106));
        fVar212 = auVar221._0_4_;
        fVar213 = auVar221._4_4_;
        fVar214 = auVar221._8_4_;
        fVar215 = auVar221._12_4_;
        fVar216 = auVar221._16_4_;
        fVar217 = auVar221._20_4_;
        fVar121 = auVar221._24_4_;
        auVar28._4_4_ = fVar213 * fVar213 * fVar213 * auVar106._4_4_ * -0.5;
        auVar28._0_4_ = fVar212 * fVar212 * fVar212 * auVar106._0_4_ * -0.5;
        auVar28._8_4_ = fVar214 * fVar214 * fVar214 * auVar106._8_4_ * -0.5;
        auVar28._12_4_ = fVar215 * fVar215 * fVar215 * auVar106._12_4_ * -0.5;
        auVar28._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
        auVar28._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
        auVar28._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar28._28_4_ = 0;
        auVar224._8_4_ = 0x3fc00000;
        auVar224._0_8_ = 0x3fc000003fc00000;
        auVar224._12_4_ = 0x3fc00000;
        auVar224._16_4_ = 0x3fc00000;
        auVar224._20_4_ = 0x3fc00000;
        auVar224._24_4_ = 0x3fc00000;
        auVar224._28_4_ = 0x3fc00000;
        auVar106 = vfmadd231ps_fma(auVar28,auVar224,auVar221);
        fVar212 = auVar106._0_4_;
        fVar213 = auVar106._4_4_;
        auVar29._4_4_ = auVar133._4_4_ * fVar213;
        auVar29._0_4_ = auVar133._0_4_ * fVar212;
        fVar214 = auVar106._8_4_;
        auVar29._8_4_ = auVar133._8_4_ * fVar214;
        fVar215 = auVar106._12_4_;
        auVar29._12_4_ = auVar133._12_4_ * fVar215;
        auVar29._16_4_ = auVar133._16_4_ * 0.0;
        auVar29._20_4_ = auVar133._20_4_ * 0.0;
        auVar29._24_4_ = auVar133._24_4_ * 0.0;
        auVar29._28_4_ = auVar221._28_4_;
        auVar30._4_4_ = fVar213 * -auVar115._4_4_;
        auVar30._0_4_ = fVar212 * -auVar115._0_4_;
        auVar30._8_4_ = fVar214 * -auVar115._8_4_;
        auVar30._12_4_ = fVar215 * -auVar115._12_4_;
        auVar30._16_4_ = -auVar115._16_4_ * 0.0;
        auVar30._20_4_ = -auVar115._20_4_ * 0.0;
        auVar30._24_4_ = -auVar115._24_4_ * 0.0;
        auVar30._28_4_ = auVar169._28_4_;
        auVar106 = vfmadd213ps_fma(auVar136,auVar136,ZEXT832(0) << 0x20);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,auVar7);
        auVar169 = vrsqrtps_avx(ZEXT1632(auVar106));
        auVar31._28_4_ = auVar195._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar215 * 0.0,
                                CONCAT48(fVar214 * 0.0,CONCAT44(fVar213 * 0.0,fVar212 * 0.0))));
        fVar212 = auVar169._0_4_;
        fVar213 = auVar169._4_4_;
        fVar214 = auVar169._8_4_;
        fVar215 = auVar169._12_4_;
        fVar216 = auVar169._16_4_;
        fVar217 = auVar169._20_4_;
        fVar121 = auVar169._24_4_;
        auVar32._4_4_ = fVar213 * fVar213 * fVar213 * auVar106._4_4_ * -0.5;
        auVar32._0_4_ = fVar212 * fVar212 * fVar212 * auVar106._0_4_ * -0.5;
        auVar32._8_4_ = fVar214 * fVar214 * fVar214 * auVar106._8_4_ * -0.5;
        auVar32._12_4_ = fVar215 * fVar215 * fVar215 * auVar106._12_4_ * -0.5;
        auVar32._16_4_ = fVar216 * fVar216 * fVar216 * -0.0;
        auVar32._20_4_ = fVar217 * fVar217 * fVar217 * -0.0;
        auVar32._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar32._28_4_ = 0;
        auVar106 = vfmadd231ps_fma(auVar32,auVar224,auVar169);
        fVar212 = auVar106._0_4_;
        fVar213 = auVar106._4_4_;
        auVar33._4_4_ = auVar7._4_4_ * fVar213;
        auVar33._0_4_ = auVar7._0_4_ * fVar212;
        fVar214 = auVar106._8_4_;
        auVar33._8_4_ = auVar7._8_4_ * fVar214;
        fVar215 = auVar106._12_4_;
        auVar33._12_4_ = auVar7._12_4_ * fVar215;
        auVar33._16_4_ = auVar7._16_4_ * 0.0;
        auVar33._20_4_ = auVar7._20_4_ * 0.0;
        auVar33._24_4_ = auVar7._24_4_ * 0.0;
        auVar33._28_4_ = 0;
        auVar34._4_4_ = -auVar136._4_4_ * fVar213;
        auVar34._0_4_ = -auVar136._0_4_ * fVar212;
        auVar34._8_4_ = -auVar136._8_4_ * fVar214;
        auVar34._12_4_ = -auVar136._12_4_ * fVar215;
        auVar34._16_4_ = -auVar136._16_4_ * 0.0;
        auVar34._20_4_ = -auVar136._20_4_ * 0.0;
        auVar34._24_4_ = -auVar136._24_4_ * 0.0;
        auVar34._28_4_ = auVar7._28_4_;
        auVar136._28_4_ = auVar169._28_4_;
        auVar136._0_28_ =
             ZEXT1628(CONCAT412(fVar215 * 0.0,
                                CONCAT48(fVar214 * 0.0,CONCAT44(fVar213 * 0.0,fVar212 * 0.0))));
        auVar106 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar143),auVar128);
        auVar169 = ZEXT1632(auVar143);
        auVar124 = vfmadd213ps_fma(auVar30,auVar169,local_320);
        auVar105 = vfmadd213ps_fma(auVar31,auVar169,ZEXT1632(auVar107));
        auVar165 = vfnmadd213ps_fma(auVar29,auVar169,auVar128);
        auVar125 = vfmadd213ps_fma(auVar33,auVar154,local_300);
        auVar104 = vfnmadd213ps_fma(auVar30,auVar169,local_320);
        auVar156 = vfmadd213ps_fma(auVar34,auVar154,_local_500);
        auVar170 = ZEXT1632(auVar143);
        auVar174 = vfnmadd231ps_fma(ZEXT1632(auVar107),auVar170,auVar31);
        auVar107 = vfmadd213ps_fma(auVar136,auVar154,ZEXT1632(auVar159));
        auVar123 = vfnmadd213ps_fma(auVar33,auVar154,local_300);
        auVar164 = vfnmadd213ps_fma(auVar34,auVar154,_local_500);
        auVar175 = vfnmadd231ps_fma(ZEXT1632(auVar159),auVar154,auVar136);
        auVar136 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar104));
        auVar169 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar174));
        auVar128._4_4_ = auVar174._4_4_ * auVar136._4_4_;
        auVar128._0_4_ = auVar174._0_4_ * auVar136._0_4_;
        auVar128._8_4_ = auVar174._8_4_ * auVar136._8_4_;
        auVar128._12_4_ = auVar174._12_4_ * auVar136._12_4_;
        auVar128._16_4_ = auVar136._16_4_ * 0.0;
        auVar128._20_4_ = auVar136._20_4_ * 0.0;
        auVar128._24_4_ = auVar136._24_4_ * 0.0;
        auVar128._28_4_ = 0;
        auVar143 = vfmsub231ps_fma(auVar128,ZEXT1632(auVar104),auVar169);
        auVar35._4_4_ = auVar165._4_4_ * auVar169._4_4_;
        auVar35._0_4_ = auVar165._0_4_ * auVar169._0_4_;
        auVar35._8_4_ = auVar165._8_4_ * auVar169._8_4_;
        auVar35._12_4_ = auVar165._12_4_ * auVar169._12_4_;
        auVar35._16_4_ = auVar169._16_4_ * 0.0;
        auVar35._20_4_ = auVar169._20_4_ * 0.0;
        auVar35._24_4_ = auVar169._24_4_ * 0.0;
        auVar35._28_4_ = auVar169._28_4_;
        auVar195 = ZEXT1632(auVar165);
        auVar169 = vsubps_avx(ZEXT1632(auVar125),auVar195);
        auVar159 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar174),auVar169);
        auVar36._4_4_ = auVar104._4_4_ * auVar169._4_4_;
        auVar36._0_4_ = auVar104._0_4_ * auVar169._0_4_;
        auVar36._8_4_ = auVar104._8_4_ * auVar169._8_4_;
        auVar36._12_4_ = auVar104._12_4_ * auVar169._12_4_;
        auVar36._16_4_ = auVar169._16_4_ * 0.0;
        auVar36._20_4_ = auVar169._20_4_ * 0.0;
        auVar36._24_4_ = auVar169._24_4_ * 0.0;
        auVar36._28_4_ = auVar169._28_4_;
        auVar165 = vfmsub231ps_fma(auVar36,auVar195,auVar136);
        auVar136 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar159 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar136,ZEXT1632(auVar159));
        auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar136,ZEXT1632(auVar143));
        auVar23 = vcmpps_avx(ZEXT1632(auVar159),ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar136 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar106),auVar23);
        auVar169 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar124),auVar23);
        auVar221 = vblendvps_avx(ZEXT1632(auVar175),ZEXT1632(auVar105),auVar23);
        auVar115 = vblendvps_avx(auVar195,ZEXT1632(auVar125),auVar23);
        auVar133 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar156),auVar23);
        auVar7 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar107),auVar23);
        auVar195 = vblendvps_avx(ZEXT1632(auVar125),auVar195,auVar23);
        auVar109 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar104),auVar23);
        auVar159 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        auVar22 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar174),auVar23);
        auVar21 = vsubps_avx(auVar195,auVar136);
        auVar109 = vsubps_avx(auVar109,auVar169);
        auVar128 = vsubps_avx(auVar22,auVar221);
        auVar129 = vsubps_avx(auVar136,auVar115);
        auVar19 = vsubps_avx(auVar169,auVar133);
        auVar20 = vsubps_avx(auVar221,auVar7);
        auVar37._4_4_ = auVar128._4_4_ * auVar136._4_4_;
        auVar37._0_4_ = auVar128._0_4_ * auVar136._0_4_;
        auVar37._8_4_ = auVar128._8_4_ * auVar136._8_4_;
        auVar37._12_4_ = auVar128._12_4_ * auVar136._12_4_;
        auVar37._16_4_ = auVar128._16_4_ * auVar136._16_4_;
        auVar37._20_4_ = auVar128._20_4_ * auVar136._20_4_;
        auVar37._24_4_ = auVar128._24_4_ * auVar136._24_4_;
        auVar37._28_4_ = auVar22._28_4_;
        auVar107 = vfmsub231ps_fma(auVar37,auVar221,auVar21);
        auVar38._4_4_ = auVar21._4_4_ * auVar169._4_4_;
        auVar38._0_4_ = auVar21._0_4_ * auVar169._0_4_;
        auVar38._8_4_ = auVar21._8_4_ * auVar169._8_4_;
        auVar38._12_4_ = auVar21._12_4_ * auVar169._12_4_;
        auVar38._16_4_ = auVar21._16_4_ * auVar169._16_4_;
        auVar38._20_4_ = auVar21._20_4_ * auVar169._20_4_;
        auVar38._24_4_ = auVar21._24_4_ * auVar169._24_4_;
        auVar38._28_4_ = auVar195._28_4_;
        auVar106 = vfmsub231ps_fma(auVar38,auVar136,auVar109);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar112._0_4_ = auVar109._0_4_ * auVar221._0_4_;
        auVar112._4_4_ = auVar109._4_4_ * auVar221._4_4_;
        auVar112._8_4_ = auVar109._8_4_ * auVar221._8_4_;
        auVar112._12_4_ = auVar109._12_4_ * auVar221._12_4_;
        auVar112._16_4_ = auVar109._16_4_ * auVar221._16_4_;
        auVar112._20_4_ = auVar109._20_4_ * auVar221._20_4_;
        auVar112._24_4_ = auVar109._24_4_ * auVar221._24_4_;
        auVar112._28_4_ = 0;
        auVar106 = vfmsub231ps_fma(auVar112,auVar169,auVar128);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
        auVar113._0_4_ = auVar20._0_4_ * auVar115._0_4_;
        auVar113._4_4_ = auVar20._4_4_ * auVar115._4_4_;
        auVar113._8_4_ = auVar20._8_4_ * auVar115._8_4_;
        auVar113._12_4_ = auVar20._12_4_ * auVar115._12_4_;
        auVar113._16_4_ = auVar20._16_4_ * auVar115._16_4_;
        auVar113._20_4_ = auVar20._20_4_ * auVar115._20_4_;
        auVar113._24_4_ = auVar20._24_4_ * auVar115._24_4_;
        auVar113._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar113,auVar129,auVar7);
        auVar39._4_4_ = auVar19._4_4_ * auVar7._4_4_;
        auVar39._0_4_ = auVar19._0_4_ * auVar7._0_4_;
        auVar39._8_4_ = auVar19._8_4_ * auVar7._8_4_;
        auVar39._12_4_ = auVar19._12_4_ * auVar7._12_4_;
        auVar39._16_4_ = auVar19._16_4_ * auVar7._16_4_;
        auVar39._20_4_ = auVar19._20_4_ * auVar7._20_4_;
        auVar39._24_4_ = auVar19._24_4_ * auVar7._24_4_;
        auVar39._28_4_ = auVar7._28_4_;
        auVar143 = vfmsub231ps_fma(auVar39,auVar133,auVar20);
        auVar40._4_4_ = auVar129._4_4_ * auVar133._4_4_;
        auVar40._0_4_ = auVar129._0_4_ * auVar133._0_4_;
        auVar40._8_4_ = auVar129._8_4_ * auVar133._8_4_;
        auVar40._12_4_ = auVar129._12_4_ * auVar133._12_4_;
        auVar40._16_4_ = auVar129._16_4_ * auVar133._16_4_;
        auVar40._20_4_ = auVar129._20_4_ * auVar133._20_4_;
        auVar40._24_4_ = auVar129._24_4_ * auVar133._24_4_;
        auVar40._28_4_ = auVar133._28_4_;
        auVar124 = vfmsub231ps_fma(auVar40,auVar19,auVar115);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar124),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
        auVar115 = vmaxps_avx(ZEXT1632(auVar106),ZEXT1632(auVar143));
        auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
        auVar107 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar159 = vpand_avx(auVar159,auVar107);
        auVar115 = vpmovsxwd_avx2(auVar159);
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) {
LAB_0159bd96:
          auVar172._8_8_ = local_5a0[1]._8_8_;
          auVar172._0_8_ = local_5a0[1]._0_8_;
          auVar172._16_8_ = local_5a0[1]._16_8_;
          auVar172._24_8_ = local_5a0[1]._24_8_;
        }
        else {
          auVar41._4_4_ = auVar109._4_4_ * auVar20._4_4_;
          auVar41._0_4_ = auVar109._0_4_ * auVar20._0_4_;
          auVar41._8_4_ = auVar109._8_4_ * auVar20._8_4_;
          auVar41._12_4_ = auVar109._12_4_ * auVar20._12_4_;
          auVar41._16_4_ = auVar109._16_4_ * auVar20._16_4_;
          auVar41._20_4_ = auVar109._20_4_ * auVar20._20_4_;
          auVar41._24_4_ = auVar109._24_4_ * auVar20._24_4_;
          auVar41._28_4_ = auVar115._28_4_;
          auVar125 = vfmsub231ps_fma(auVar41,auVar19,auVar128);
          auVar131._0_4_ = auVar129._0_4_ * auVar128._0_4_;
          auVar131._4_4_ = auVar129._4_4_ * auVar128._4_4_;
          auVar131._8_4_ = auVar129._8_4_ * auVar128._8_4_;
          auVar131._12_4_ = auVar129._12_4_ * auVar128._12_4_;
          auVar131._16_4_ = auVar129._16_4_ * auVar128._16_4_;
          auVar131._20_4_ = auVar129._20_4_ * auVar128._20_4_;
          auVar131._24_4_ = auVar129._24_4_ * auVar128._24_4_;
          auVar131._28_4_ = 0;
          auVar105 = vfmsub231ps_fma(auVar131,auVar21,auVar20);
          auVar42._4_4_ = auVar21._4_4_ * auVar19._4_4_;
          auVar42._0_4_ = auVar21._0_4_ * auVar19._0_4_;
          auVar42._8_4_ = auVar21._8_4_ * auVar19._8_4_;
          auVar42._12_4_ = auVar21._12_4_ * auVar19._12_4_;
          auVar42._16_4_ = auVar21._16_4_ * auVar19._16_4_;
          auVar42._20_4_ = auVar21._20_4_ * auVar19._20_4_;
          auVar42._24_4_ = auVar21._24_4_ * auVar19._24_4_;
          auVar42._28_4_ = auVar21._28_4_;
          auVar156 = vfmsub231ps_fma(auVar42,auVar129,auVar109);
          auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar105),ZEXT1632(auVar156));
          auVar124 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar125),_DAT_01faff00);
          auVar115 = vrcpps_avx(ZEXT1632(auVar124));
          auVar209._8_4_ = 0x3f800000;
          auVar209._0_8_ = 0x3f8000003f800000;
          auVar209._12_4_ = 0x3f800000;
          auVar209._16_4_ = 0x3f800000;
          auVar209._20_4_ = 0x3f800000;
          auVar209._24_4_ = 0x3f800000;
          auVar209._28_4_ = 0x3f800000;
          auVar107 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar124),auVar209);
          auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar115,auVar115);
          auVar43._4_4_ = auVar156._4_4_ * auVar221._4_4_;
          auVar43._0_4_ = auVar156._0_4_ * auVar221._0_4_;
          auVar43._8_4_ = auVar156._8_4_ * auVar221._8_4_;
          auVar43._12_4_ = auVar156._12_4_ * auVar221._12_4_;
          auVar43._16_4_ = auVar221._16_4_ * 0.0;
          auVar43._20_4_ = auVar221._20_4_ * 0.0;
          auVar43._24_4_ = auVar221._24_4_ * 0.0;
          auVar43._28_4_ = auVar221._28_4_;
          auVar105 = vfmadd231ps_fma(auVar43,auVar169,ZEXT1632(auVar105));
          auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),ZEXT1632(auVar125),auVar136);
          fVar212 = auVar107._0_4_;
          fVar213 = auVar107._4_4_;
          fVar214 = auVar107._8_4_;
          fVar215 = auVar107._12_4_;
          auVar44._28_4_ = auVar169._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar215 * auVar105._12_4_,
                                  CONCAT48(fVar214 * auVar105._8_4_,
                                           CONCAT44(fVar213 * auVar105._4_4_,
                                                    fVar212 * auVar105._0_4_))));
          auVar114._4_4_ = uVar96;
          auVar114._0_4_ = uVar96;
          auVar114._8_4_ = uVar96;
          auVar114._12_4_ = uVar96;
          auVar114._16_4_ = uVar96;
          auVar114._20_4_ = uVar96;
          auVar114._24_4_ = uVar96;
          auVar114._28_4_ = uVar96;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar132._4_4_ = uVar102;
          auVar132._0_4_ = uVar102;
          auVar132._8_4_ = uVar102;
          auVar132._12_4_ = uVar102;
          auVar132._16_4_ = uVar102;
          auVar132._20_4_ = uVar102;
          auVar132._24_4_ = uVar102;
          auVar132._28_4_ = uVar102;
          auVar169 = vcmpps_avx(auVar114,auVar44,2);
          auVar221 = vcmpps_avx(auVar44,auVar132,2);
          auVar169 = vandps_avx(auVar221,auVar169);
          auVar107 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
          auVar159 = vpand_avx(auVar159,auVar107);
          auVar169 = vpmovsxwd_avx2(auVar159);
          if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar169 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar169 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar169 >> 0x7f,0) == '\0') &&
                (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar169 >> 0xbf,0) == '\0') &&
              (auVar169 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar169[0x1f]) goto LAB_0159bd96;
          auVar169 = vcmpps_avx(ZEXT1632(auVar124),ZEXT832(0) << 0x20,4);
          auVar107 = vpackssdw_avx(auVar169._0_16_,auVar169._16_16_);
          auVar159 = vpand_avx(auVar159,auVar107);
          auVar169 = vpmovsxwd_avx2(auVar159);
          auVar172._8_8_ = local_5a0[1]._8_8_;
          auVar172._0_8_ = local_5a0[1]._0_8_;
          auVar172._16_8_ = local_5a0[1]._16_8_;
          auVar172._24_8_ = local_5a0[1]._24_8_;
          if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar169 >> 0x7f,0) != '\0') ||
                (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar169 >> 0xbf,0) != '\0') ||
              (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar169[0x1f] < '\0') {
            auVar115 = ZEXT1632(CONCAT412(fVar215 * auVar106._12_4_,
                                          CONCAT48(fVar214 * auVar106._8_4_,
                                                   CONCAT44(fVar213 * auVar106._4_4_,
                                                            fVar212 * auVar106._0_4_))));
            auVar133 = ZEXT1632(CONCAT412(fVar215 * auVar143._12_4_,
                                          CONCAT48(fVar214 * auVar143._8_4_,
                                                   CONCAT44(fVar213 * auVar143._4_4_,
                                                            fVar212 * auVar143._0_4_))));
            auVar171._8_4_ = 0x3f800000;
            auVar171._0_8_ = 0x3f8000003f800000;
            auVar171._12_4_ = 0x3f800000;
            auVar171._16_4_ = 0x3f800000;
            auVar171._20_4_ = 0x3f800000;
            auVar171._24_4_ = 0x3f800000;
            auVar171._28_4_ = 0x3f800000;
            auVar221 = vsubps_avx(auVar171,auVar115);
            _local_160 = vblendvps_avx(auVar221,auVar115,auVar23);
            auVar221 = vsubps_avx(auVar171,auVar133);
            local_380 = vblendvps_avx(auVar221,auVar133,auVar23);
            auVar172 = auVar169;
            local_520 = auVar44;
          }
        }
        auVar226 = ZEXT3264(local_760);
        auVar220 = ZEXT3264(_local_620);
        auVar210 = ZEXT3264(local_680);
        auVar163 = ZEXT3264(auVar204);
        auVar141 = ZEXT3264(auVar160);
        if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar172 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar172 >> 0x7f,0) == '\0') &&
              (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar172 >> 0xbf,0) == '\0') &&
            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar172[0x1f]) {
          auVar141 = ZEXT3264(local_660);
          auVar163 = ZEXT3264(local_5c0);
          auVar192 = ZEXT3264(local_740);
        }
        else {
          auVar169 = vsubps_avx(auVar154,auVar170);
          auVar159 = vfmadd213ps_fma(auVar169,_local_160,auVar170);
          fVar212 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar45._4_4_ = (auVar159._4_4_ + auVar159._4_4_) * fVar212;
          auVar45._0_4_ = (auVar159._0_4_ + auVar159._0_4_) * fVar212;
          auVar45._8_4_ = (auVar159._8_4_ + auVar159._8_4_) * fVar212;
          auVar45._12_4_ = (auVar159._12_4_ + auVar159._12_4_) * fVar212;
          auVar45._16_4_ = fVar212 * 0.0;
          auVar45._20_4_ = fVar212 * 0.0;
          auVar45._24_4_ = fVar212 * 0.0;
          auVar45._28_4_ = 0;
          auVar169 = vcmpps_avx(local_520,auVar45,6);
          auVar221 = auVar172 & auVar169;
          auVar192 = ZEXT3264(local_740);
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0xbf,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0x1f]) {
            auVar141 = ZEXT3264(local_660);
            auVar163 = ZEXT3264(local_5c0);
          }
          else {
            auVar134._8_4_ = 0xbf800000;
            auVar134._0_8_ = 0xbf800000bf800000;
            auVar134._12_4_ = 0xbf800000;
            auVar134._16_4_ = 0xbf800000;
            auVar134._20_4_ = 0xbf800000;
            auVar134._24_4_ = 0xbf800000;
            auVar134._28_4_ = 0xbf800000;
            auVar153._8_4_ = 0x40000000;
            auVar153._0_8_ = 0x4000000040000000;
            auVar153._12_4_ = 0x40000000;
            auVar153._16_4_ = 0x40000000;
            auVar153._20_4_ = 0x40000000;
            auVar153._24_4_ = 0x40000000;
            auVar153._28_4_ = 0x40000000;
            auVar159 = vfmadd213ps_fma(local_380,auVar153,auVar134);
            local_2a0 = _local_160;
            local_380 = ZEXT1632(auVar159);
            auVar221 = local_380;
            local_280 = ZEXT1632(auVar159);
            local_260 = local_520;
            local_240 = 0;
            local_23c = iVar9;
            local_230 = uVar90;
            uStack_228 = uVar91;
            local_220 = local_7a0;
            uStack_218 = uStack_798;
            local_210 = local_7b0;
            uStack_208 = uStack_7a8;
            local_200 = local_7c0;
            uStack_1f8 = uStack_7b8;
            local_380 = auVar221;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5a0[0] = vandps_avx(auVar169,auVar172);
              fVar212 = 1.0 / auVar110._0_4_;
              local_1c0[0] = fVar212 * ((float)local_160._0_4_ + 0.0);
              local_1c0[1] = fVar212 * ((float)local_160._4_4_ + 1.0);
              local_1c0[2] = fVar212 * (fStack_158 + 2.0);
              local_1c0[3] = fVar212 * (fStack_154 + 3.0);
              fStack_1b0 = fVar212 * (fStack_150 + 4.0);
              fStack_1ac = fVar212 * (fStack_14c + 5.0);
              fStack_1a8 = fVar212 * (fStack_148 + 6.0);
              fStack_1a4 = fStack_144 + 7.0;
              local_380._0_8_ = auVar159._0_8_;
              local_380._8_8_ = auVar159._8_8_;
              local_1a0 = local_380._0_8_;
              uStack_198 = local_380._8_8_;
              uStack_190 = 0;
              uStack_188 = 0;
              local_180 = local_520;
              auVar135._8_4_ = 0x7f800000;
              auVar135._0_8_ = 0x7f8000007f800000;
              auVar135._12_4_ = 0x7f800000;
              auVar135._16_4_ = 0x7f800000;
              auVar135._20_4_ = 0x7f800000;
              auVar135._24_4_ = 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar169 = vblendvps_avx(auVar135,local_520,local_5a0[0]);
              auVar221 = vshufps_avx(auVar169,auVar169,0xb1);
              auVar221 = vminps_avx(auVar169,auVar221);
              auVar115 = vshufpd_avx(auVar221,auVar221,5);
              auVar221 = vminps_avx(auVar221,auVar115);
              auVar115 = vpermpd_avx2(auVar221,0x4e);
              auVar221 = vminps_avx(auVar221,auVar115);
              auVar221 = vcmpps_avx(auVar169,auVar221,0);
              auVar115 = local_5a0[0] & auVar221;
              auVar169 = local_5a0[0];
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar169 = vandps_avx(auVar221,local_5a0[0]);
              }
              uVar94 = vmovmskps_avx(auVar169);
              uVar96 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                uVar96 = uVar96 + 1;
              }
              uVar95 = (ulong)uVar96;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar212 = local_1c0[uVar95];
                uVar102 = *(undefined4 *)((long)&local_1a0 + uVar95 * 4);
                fVar214 = 1.0 - fVar212;
                fVar213 = fVar214 * fVar214 * -3.0;
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214)),
                                          ZEXT416((uint)(fVar212 * fVar214)),ZEXT416(0xc0000000));
                auVar159 = vfmsub132ss_fma(ZEXT416((uint)(fVar212 * fVar214)),
                                           ZEXT416((uint)(fVar212 * fVar212)),ZEXT416(0x40000000));
                fVar214 = auVar13._0_4_ * 3.0;
                fVar215 = auVar159._0_4_ * 3.0;
                fVar216 = fVar212 * fVar212 * 3.0;
                auVar177._0_4_ = fVar216 * fVar118;
                auVar177._4_4_ = fVar216 * fVar119;
                auVar177._8_4_ = fVar216 * fVar120;
                auVar177._12_4_ = fVar216 * fVar15;
                auVar144._4_4_ = fVar215;
                auVar144._0_4_ = fVar215;
                auVar144._8_4_ = fVar215;
                auVar144._12_4_ = fVar215;
                auVar13 = vfmadd132ps_fma(auVar144,auVar177,auVar18);
                auVar157._4_4_ = fVar214;
                auVar157._0_4_ = fVar214;
                auVar157._8_4_ = fVar214;
                auVar157._12_4_ = fVar214;
                auVar13 = vfmadd132ps_fma(auVar157,auVar13,auVar17);
                auVar145._4_4_ = fVar213;
                auVar145._0_4_ = fVar213;
                auVar145._8_4_ = fVar213;
                auVar145._12_4_ = fVar213;
                auVar13 = vfmadd132ps_fma(auVar145,auVar13,*(undefined1 (*) [16])pPVar1);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar95 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar13._0_4_;
                uVar197 = vextractps_avx(auVar13,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar197;
                uVar197 = vextractps_avx(auVar13,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar197;
                *(float *)(ray + k * 4 + 0xf0) = fVar212;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar102;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x120) = local_7e0._4_4_;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_7e0._0_4_ = local_7e0._4_4_;
                local_7e0._8_4_ = local_7e0._4_4_;
                local_7e0._12_4_ = local_7e0._4_4_;
                local_5e0._0_8_ = CONCAT44(uVar4,uVar4);
                local_5e0 = ZEXT1632(CONCAT412(uVar4,CONCAT48(uVar4,local_5e0._0_8_)));
                local_4e0 = ZEXT1632(*local_6a8);
                auStack_830 = auVar136._16_16_;
                local_840 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_6e0 = auVar160;
                local_6a0 = auVar204;
                while( true ) {
                  auVar136 = _local_840;
                  local_400 = local_1c0[uVar95];
                  local_3f0 = *(undefined4 *)((long)&local_1a0 + uVar95 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar95 * 4);
                  fVar214 = 1.0 - local_400;
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214)),
                                             ZEXT416((uint)(local_400 * fVar214)),
                                             ZEXT416(0xc0000000));
                  auVar159 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar214)),
                                             ZEXT416((uint)(local_400 * local_400)),
                                             ZEXT416(0x40000000));
                  fVar212 = auVar159._0_4_ * 3.0;
                  fVar213 = local_400 * local_400 * 3.0;
                  auVar180._0_4_ = fVar213 * fVar118;
                  auVar180._4_4_ = fVar213 * fVar119;
                  auVar180._8_4_ = fVar213 * fVar120;
                  auVar180._12_4_ = fVar213 * fVar15;
                  auVar150._4_4_ = fVar212;
                  auVar150._0_4_ = fVar212;
                  auVar150._8_4_ = fVar212;
                  auVar150._12_4_ = fVar212;
                  auVar159 = vfmadd132ps_fma(auVar150,auVar180,auVar18);
                  fVar212 = auVar107._0_4_ * 3.0;
                  auVar168._4_4_ = fVar212;
                  auVar168._0_4_ = fVar212;
                  auVar168._8_4_ = fVar212;
                  auVar168._12_4_ = fVar212;
                  auVar159 = vfmadd132ps_fma(auVar168,auVar159,auVar17);
                  fVar212 = fVar214 * fVar214 * -3.0;
                  local_710.context = context->user;
                  auVar151._4_4_ = fVar212;
                  auVar151._0_4_ = fVar212;
                  auVar151._8_4_ = fVar212;
                  auVar151._12_4_ = fVar212;
                  auVar107 = vfmadd132ps_fma(auVar151,auVar159,auVar13);
                  local_430 = auVar107._0_4_;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  auVar159 = vshufps_avx(auVar107,auVar107,0x55);
                  local_420 = auVar159;
                  local_410 = vshufps_avx(auVar107,auVar107,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  uStack_3ec = local_3f0;
                  uStack_3e8 = local_3f0;
                  uStack_3e4 = local_3f0;
                  local_3e0 = local_5e0._0_8_;
                  uStack_3d8 = local_5e0._8_8_;
                  local_3d0 = local_7e0;
                  vpcmpeqd_avx2(ZEXT1632(local_7e0),ZEXT1632(local_7e0));
                  uStack_3bc = (local_710.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_710.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_790 = local_4e0._0_16_;
                  local_710.valid = (int *)local_790;
                  local_710.geometryUserPtr = *(void **)(CONCAT44(uStack_55c,local_560) + 0x18);
                  local_710.hit = (RTCHitN *)&local_430;
                  local_710.N = 4;
                  pcVar12 = *(code **)(CONCAT44(uStack_55c,local_560) + 0x40);
                  local_710.ray = (RTCRayN *)ray;
                  if (pcVar12 != (code *)0x0) {
                    (*pcVar12)(&local_710);
                    auVar220 = ZEXT3264(_local_620);
                    auVar163 = ZEXT3264(local_6a0);
                    auVar210 = ZEXT3264(local_680);
                    auVar141 = ZEXT3264(local_6e0);
                    auVar226 = ZEXT3264(local_760);
                    auVar192 = ZEXT3264(local_740);
                    pLVar98 = local_778;
                    pre = local_770;
                    pPVar99 = local_768;
                  }
                  if (local_790 == (undefined1  [16])0x0) {
                    auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar159 = auVar159 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_55c,local_560) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var11)(&local_710);
                      auVar220 = ZEXT3264(_local_620);
                      auVar163 = ZEXT3264(local_6a0);
                      auVar210 = ZEXT3264(local_680);
                      auVar141 = ZEXT3264(local_6e0);
                      auVar226 = ZEXT3264(local_760);
                      auVar192 = ZEXT3264(local_740);
                      pLVar98 = local_778;
                      pre = local_770;
                      pPVar99 = local_768;
                    }
                    auVar107 = vpcmpeqd_avx(local_790,_DAT_01f7aa10);
                    auVar106 = vpcmpeqd_avx(auVar159,auVar159);
                    auVar159 = auVar107 ^ auVar106;
                    if (local_790 != (undefined1  [16])0x0) {
                      auVar107 = auVar107 ^ auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])local_710.hit);
                      *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x10));
                      *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x20));
                      *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x30));
                      *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x40));
                      *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x50));
                      *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x60));
                      *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar106;
                      auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x70));
                      *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar106;
                      auVar107 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                          (local_710.hit + 0x80));
                      *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar107;
                    }
                  }
                  auVar169 = local_520;
                  auVar160 = auVar141._0_32_;
                  auVar204 = auVar163._0_32_;
                  auVar127._8_8_ = 0x100000001;
                  auVar127._0_8_ = 0x100000001;
                  if ((auVar127 & auVar159) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                  }
                  else {
                    local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_840._4_4_ = 0;
                    local_840._8_4_ = 0;
                    local_840._12_4_ = 0;
                  }
                  *(undefined4 *)(local_5a0[0] + uVar95 * 4) = 0;
                  auStack_830 = auVar136._16_16_;
                  auVar117._4_4_ = local_840._0_4_;
                  auVar117._0_4_ = local_840._0_4_;
                  auVar117._8_4_ = local_840._0_4_;
                  auVar117._12_4_ = local_840._0_4_;
                  auVar117._16_4_ = local_840._0_4_;
                  auVar117._20_4_ = local_840._0_4_;
                  auVar117._24_4_ = local_840._0_4_;
                  auVar117._28_4_ = local_840._0_4_;
                  auVar221 = vcmpps_avx(auVar169,auVar117,2);
                  auVar136 = vandps_avx(auVar221,local_5a0[0]);
                  local_5a0[0] = local_5a0[0] & auVar221;
                  if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                           && (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) &&
                          (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                         && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                        (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                      (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5a0[0][0x1f]) break;
                  auVar140._8_4_ = 0x7f800000;
                  auVar140._0_8_ = 0x7f8000007f800000;
                  auVar140._12_4_ = 0x7f800000;
                  auVar140._16_4_ = 0x7f800000;
                  auVar140._20_4_ = 0x7f800000;
                  auVar140._24_4_ = 0x7f800000;
                  auVar140._28_4_ = 0x7f800000;
                  auVar169 = vblendvps_avx(auVar140,auVar169,auVar136);
                  auVar221 = vshufps_avx(auVar169,auVar169,0xb1);
                  auVar221 = vminps_avx(auVar169,auVar221);
                  auVar115 = vshufpd_avx(auVar221,auVar221,5);
                  auVar221 = vminps_avx(auVar221,auVar115);
                  auVar115 = vpermpd_avx2(auVar221,0x4e);
                  auVar221 = vminps_avx(auVar221,auVar115);
                  auVar221 = vcmpps_avx(auVar169,auVar221,0);
                  auVar115 = auVar136 & auVar221;
                  auVar169 = auVar136;
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0x7f,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0xbf,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar115[0x1f] < '\0') {
                    auVar169 = vandps_avx(auVar221,auVar136);
                  }
                  uVar94 = vmovmskps_avx(auVar169);
                  uVar96 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar96 = uVar96 + 1;
                  }
                  uVar95 = (ulong)uVar96;
                  local_5a0[0] = auVar136;
                }
              }
            }
            auVar141 = ZEXT3264(local_660);
            auVar163 = ZEXT3264(local_5c0);
          }
        }
      }
      if (8 < iVar9) {
        _local_620 = auVar220._0_32_;
        local_680 = auVar210._0_32_;
        local_320._4_4_ = iVar9;
        local_320._0_4_ = iVar9;
        local_320._8_4_ = iVar9;
        local_320._12_4_ = iVar9;
        local_320._16_4_ = iVar9;
        local_320._20_4_ = iVar9;
        local_320._24_4_ = iVar9;
        local_320._28_4_ = iVar9;
        local_360._4_4_ = fVar206;
        local_360._0_4_ = fVar206;
        fStack_358 = fVar206;
        fStack_354 = fVar206;
        fStack_350 = fVar206;
        fStack_34c = fVar206;
        fStack_348 = fVar206;
        fStack_344 = fVar206;
        local_560 = local_600._0_4_;
        uStack_55c = local_600._0_4_;
        uStack_558 = local_600._0_4_;
        uStack_554 = local_600._0_4_;
        uStack_550 = local_600._0_4_;
        uStack_54c = local_600._0_4_;
        uStack_548 = local_600._0_4_;
        uStack_544 = local_600._0_4_;
        local_120 = 1.0 / (float)local_630._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_630._4_4_ = local_7e0._4_4_;
        local_630._0_4_ = local_7e0._4_4_;
        uStack_628 = local_7e0._4_4_;
        uStack_624 = local_7e0._4_4_;
        local_2d0 = uVar4;
        uStack_2cc = uVar4;
        uStack_2c8 = uVar4;
        uStack_2c4 = uVar4;
        lVar100 = 8;
        local_6e0 = auVar160;
        local_6a0 = auVar204;
        do {
          auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar100 * 4 + lVar24);
          auVar169 = *(undefined1 (*) [32])(lVar24 + 0x21aa768 + lVar100 * 4);
          auVar221 = *(undefined1 (*) [32])(lVar24 + 0x21aabec + lVar100 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar24 + 0x21ab070 + lVar100 * 4);
          fVar121 = *(float *)*pauVar2;
          fVar81 = *(float *)(*pauVar2 + 4);
          fVar82 = *(float *)(*pauVar2 + 8);
          fVar122 = *(float *)(*pauVar2 + 0xc);
          fVar142 = *(float *)(*pauVar2 + 0x10);
          fVar173 = *(float *)(*pauVar2 + 0x14);
          fVar185 = *(float *)(*pauVar2 + 0x18);
          auVar93 = *pauVar2;
          auVar211._0_4_ = local_460 * fVar121;
          auVar211._4_4_ = fStack_45c * fVar81;
          auVar211._8_4_ = fStack_458 * fVar82;
          auVar211._12_4_ = fStack_454 * fVar122;
          auVar211._16_4_ = fStack_450 * fVar142;
          auVar211._20_4_ = fStack_44c * fVar173;
          auVar211._28_36_ = auVar210._28_36_;
          auVar211._24_4_ = fStack_448 * fVar185;
          auVar210._0_4_ = (float)local_140 * fVar121;
          auVar210._4_4_ = local_140._4_4_ * fVar81;
          auVar210._8_4_ = (float)uStack_138 * fVar82;
          auVar210._12_4_ = uStack_138._4_4_ * fVar122;
          auVar210._16_4_ = (float)uStack_130 * fVar142;
          auVar210._20_4_ = uStack_130._4_4_ * fVar173;
          auVar210._28_36_ = auVar220._28_36_;
          auVar210._24_4_ = (float)uStack_128 * fVar185;
          auVar13 = vfmadd231ps_fma(auVar211._0_32_,auVar221,auVar141._0_32_);
          auVar159 = vfmadd231ps_fma(auVar210._0_32_,auVar221,auVar163._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar169,auVar192._0_32_);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar169,local_4a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar136,auVar226._0_32_);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar136,local_480);
          auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar100 * 4 + lVar24);
          auVar133 = *(undefined1 (*) [32])(lVar24 + 0x21acb88 + lVar100 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar24 + 0x21ad00c + lVar100 * 4);
          pfVar3 = (float *)(lVar24 + 0x21ad490 + lVar100 * 4);
          fVar83 = *pfVar3;
          fVar84 = pfVar3[1];
          fVar85 = pfVar3[2];
          fVar86 = pfVar3[3];
          fVar87 = pfVar3[4];
          fVar88 = pfVar3[5];
          fVar89 = pfVar3[6];
          auVar80._4_4_ = fVar84 * fStack_45c;
          auVar80._0_4_ = fVar83 * local_460;
          auVar80._8_4_ = fVar85 * fStack_458;
          auVar80._12_4_ = fVar86 * fStack_454;
          auVar80._16_4_ = fVar87 * fStack_450;
          auVar80._20_4_ = fVar88 * fStack_44c;
          auVar80._24_4_ = fVar89 * fStack_448;
          auVar80._28_4_ = fStack_444;
          auVar46._4_4_ = local_140._4_4_ * fVar84;
          auVar46._0_4_ = (float)local_140 * fVar83;
          auVar46._8_4_ = (float)uStack_138 * fVar85;
          auVar46._12_4_ = uStack_138._4_4_ * fVar86;
          auVar46._16_4_ = (float)uStack_130 * fVar87;
          auVar46._20_4_ = uStack_130._4_4_ * fVar88;
          auVar46._24_4_ = (float)uStack_128 * fVar89;
          auVar46._28_4_ = auVar136._28_4_;
          auVar107 = vfmadd231ps_fma(auVar80,auVar7,auVar141._0_32_);
          auVar106 = vfmadd231ps_fma(auVar46,auVar7,auVar163._0_32_);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar133,auVar192._0_32_);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar133,local_4a0);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar115,auVar226._0_32_);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar115,local_480);
          local_4e0 = ZEXT1632(auVar107);
          local_5e0 = ZEXT1632(auVar13);
          auVar109 = vsubps_avx(local_4e0,local_5e0);
          local_300 = ZEXT1632(auVar159);
          local_600 = ZEXT1632(auVar106);
          auVar22 = vsubps_avx(local_600,local_300);
          auVar220 = ZEXT3264(auVar22);
          auVar78._4_4_ = auVar159._4_4_ * auVar109._4_4_;
          auVar78._0_4_ = auVar159._0_4_ * auVar109._0_4_;
          auVar78._8_4_ = auVar159._8_4_ * auVar109._8_4_;
          auVar78._12_4_ = auVar159._12_4_ * auVar109._12_4_;
          auVar78._16_4_ = auVar109._16_4_ * 0.0;
          auVar78._20_4_ = auVar109._20_4_ * 0.0;
          auVar78._24_4_ = auVar109._24_4_ * 0.0;
          auVar78._28_4_ = local_4a0._28_4_;
          fVar206 = auVar22._0_4_;
          auVar163._0_4_ = auVar13._0_4_ * fVar206;
          fVar212 = auVar22._4_4_;
          auVar163._4_4_ = auVar13._4_4_ * fVar212;
          fVar213 = auVar22._8_4_;
          auVar163._8_4_ = auVar13._8_4_ * fVar213;
          fVar214 = auVar22._12_4_;
          auVar163._12_4_ = auVar13._12_4_ * fVar214;
          fVar215 = auVar22._16_4_;
          auVar163._16_4_ = fVar215 * 0.0;
          fVar216 = auVar22._20_4_;
          auVar163._20_4_ = fVar216 * 0.0;
          fVar217 = auVar22._24_4_;
          auVar163._28_36_ = auVar141._28_36_;
          auVar163._24_4_ = fVar217 * 0.0;
          auVar154 = vsubps_avx(auVar78,auVar163._0_32_);
          auVar47._4_4_ = local_e0._4_4_ * fVar81;
          auVar47._0_4_ = (float)local_e0 * fVar121;
          auVar47._8_4_ = (float)uStack_d8 * fVar82;
          auVar47._12_4_ = uStack_d8._4_4_ * fVar122;
          auVar47._16_4_ = (float)uStack_d0 * fVar142;
          auVar47._20_4_ = uStack_d0._4_4_ * fVar173;
          auVar47._24_4_ = (float)uStack_c8 * fVar185;
          auVar47._28_4_ = local_4a0._28_4_;
          auVar13 = vfmadd231ps_fma(auVar47,auVar221,local_c0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_a0,auVar169);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_80,auVar136);
          auVar48._4_4_ = fVar84 * local_e0._4_4_;
          auVar48._0_4_ = fVar83 * (float)local_e0;
          auVar48._8_4_ = fVar85 * (float)uStack_d8;
          auVar48._12_4_ = fVar86 * uStack_d8._4_4_;
          auVar48._16_4_ = fVar87 * (float)uStack_d0;
          auVar48._20_4_ = fVar88 * uStack_d0._4_4_;
          auVar48._24_4_ = fVar89 * (float)uStack_c8;
          auVar48._28_4_ = uStack_c8._4_4_;
          auVar159 = vfmadd231ps_fma(auVar48,auVar7,local_c0);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar133,local_a0);
          auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar115,local_80);
          auVar49._4_4_ = fVar212 * fVar212;
          auVar49._0_4_ = fVar206 * fVar206;
          auVar49._8_4_ = fVar213 * fVar213;
          auVar49._12_4_ = fVar214 * fVar214;
          auVar49._16_4_ = fVar215 * fVar215;
          auVar49._20_4_ = fVar216 * fVar216;
          auVar49._24_4_ = fVar217 * fVar217;
          auVar49._28_4_ = uStack_128._4_4_;
          auVar107 = vfmadd231ps_fma(auVar49,auVar109,auVar109);
          local_4c0 = ZEXT1632(auVar13);
          auVar195 = vmaxps_avx(local_4c0,ZEXT1632(auVar159));
          fVar206 = auVar195._0_4_ * auVar195._0_4_;
          fVar212 = auVar195._4_4_ * auVar195._4_4_;
          fVar213 = auVar195._8_4_ * auVar195._8_4_;
          fVar214 = auVar195._12_4_ * auVar195._12_4_;
          fVar215 = auVar195._16_4_ * auVar195._16_4_;
          fVar216 = auVar195._20_4_ * auVar195._20_4_;
          fVar217 = auVar195._24_4_ * auVar195._24_4_;
          auVar210 = ZEXT3264(CONCAT428(auVar195._28_4_,
                                        CONCAT424(fVar217,CONCAT420(fVar216,CONCAT416(fVar215,
                                                  CONCAT412(fVar214,CONCAT48(fVar213,CONCAT44(
                                                  fVar212,fVar206))))))));
          auVar200._0_4_ = fVar206 * auVar107._0_4_;
          auVar200._4_4_ = fVar212 * auVar107._4_4_;
          auVar200._8_4_ = fVar213 * auVar107._8_4_;
          auVar200._12_4_ = fVar214 * auVar107._12_4_;
          auVar200._16_4_ = fVar215 * 0.0;
          auVar200._20_4_ = fVar216 * 0.0;
          auVar200._24_4_ = fVar217 * 0.0;
          auVar200._28_4_ = 0;
          auVar50._4_4_ = auVar154._4_4_ * auVar154._4_4_;
          auVar50._0_4_ = auVar154._0_4_ * auVar154._0_4_;
          auVar50._8_4_ = auVar154._8_4_ * auVar154._8_4_;
          auVar50._12_4_ = auVar154._12_4_ * auVar154._12_4_;
          auVar50._16_4_ = auVar154._16_4_ * auVar154._16_4_;
          auVar50._20_4_ = auVar154._20_4_ * auVar154._20_4_;
          auVar50._24_4_ = auVar154._24_4_ * auVar154._24_4_;
          auVar50._28_4_ = auVar154._28_4_;
          auVar195 = vcmpps_avx(auVar50,auVar200,2);
          local_240 = (int)lVar100;
          auVar201._4_4_ = local_240;
          auVar201._0_4_ = local_240;
          auVar201._8_4_ = local_240;
          auVar201._12_4_ = local_240;
          auVar201._16_4_ = local_240;
          auVar201._20_4_ = local_240;
          auVar201._24_4_ = local_240;
          auVar201._28_4_ = local_240;
          auVar154 = vpor_avx2(auVar201,_DAT_01fe9900);
          auVar23 = vpcmpgtd_avx2(local_320,auVar154);
          auVar154 = auVar23 & auVar195;
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar154 >> 0x7f,0) == '\0') &&
                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0xbf,0) == '\0') &&
              (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar154[0x1f]) {
            auVar141 = ZEXT3264(local_660);
            auVar192 = ZEXT3264(local_740);
            auVar226 = ZEXT3264(local_760);
          }
          else {
            local_340 = vandps_avx(auVar23,auVar195);
            auVar51._4_4_ = (float)local_620._4_4_ * fVar84;
            auVar51._0_4_ = (float)local_620._0_4_ * fVar83;
            auVar51._8_4_ = fStack_618 * fVar85;
            auVar51._12_4_ = fStack_614 * fVar86;
            auVar51._16_4_ = fStack_610 * fVar87;
            auVar51._20_4_ = fStack_60c * fVar88;
            auVar51._24_4_ = fStack_608 * fVar89;
            auVar51._28_4_ = auVar195._28_4_;
            auVar13 = vfmadd213ps_fma(auVar7,local_6a0,auVar51);
            auVar13 = vfmadd213ps_fma(auVar133,local_680,ZEXT1632(auVar13));
            auVar13 = vfmadd213ps_fma(auVar115,local_6e0,ZEXT1632(auVar13));
            local_500._0_4_ = auVar93._0_4_;
            local_500._4_4_ = auVar93._4_4_;
            fStack_4f8 = auVar93._8_4_;
            fStack_4f4 = auVar93._12_4_;
            fStack_4f0 = auVar93._16_4_;
            fStack_4ec = auVar93._20_4_;
            fStack_4e8 = auVar93._24_4_;
            auVar52._4_4_ = (float)local_620._4_4_ * (float)local_500._4_4_;
            auVar52._0_4_ = (float)local_620._0_4_ * (float)local_500._0_4_;
            auVar52._8_4_ = fStack_618 * fStack_4f8;
            auVar52._12_4_ = fStack_614 * fStack_4f4;
            auVar52._16_4_ = fStack_610 * fStack_4f0;
            auVar52._20_4_ = fStack_60c * fStack_4ec;
            auVar52._24_4_ = fStack_608 * fStack_4e8;
            auVar52._28_4_ = auVar195._28_4_;
            auVar107 = vfmadd213ps_fma(auVar221,local_6a0,auVar52);
            auVar107 = vfmadd213ps_fma(auVar169,local_680,ZEXT1632(auVar107));
            auVar169 = *(undefined1 (*) [32])(lVar24 + 0x21ab4f4 + lVar100 * 4);
            auVar221 = *(undefined1 (*) [32])(lVar24 + 0x21ab978 + lVar100 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar24 + 0x21abdfc + lVar100 * 4);
            pfVar3 = (float *)(lVar24 + 0x21ac280 + lVar100 * 4);
            fVar206 = *pfVar3;
            fVar212 = pfVar3[1];
            fVar213 = pfVar3[2];
            fVar214 = pfVar3[3];
            fVar215 = pfVar3[4];
            fVar216 = pfVar3[5];
            fVar217 = pfVar3[6];
            auVar53._4_4_ = fVar212 * fStack_45c;
            auVar53._0_4_ = fVar206 * local_460;
            auVar53._8_4_ = fVar213 * fStack_458;
            auVar53._12_4_ = fVar214 * fStack_454;
            auVar53._16_4_ = fVar215 * fStack_450;
            auVar53._20_4_ = fVar216 * fStack_44c;
            auVar53._24_4_ = fVar217 * fStack_448;
            auVar53._28_4_ = local_6a0._28_4_;
            auVar54._4_4_ = local_140._4_4_ * fVar212;
            auVar54._0_4_ = (float)local_140 * fVar206;
            auVar54._8_4_ = (float)uStack_138 * fVar213;
            auVar54._12_4_ = uStack_138._4_4_ * fVar214;
            auVar54._16_4_ = (float)uStack_130 * fVar215;
            auVar54._20_4_ = uStack_130._4_4_ * fVar216;
            uVar102 = auVar22._28_4_;
            auVar54._24_4_ = (float)uStack_128 * fVar217;
            auVar54._28_4_ = uVar102;
            auVar55._4_4_ = (float)local_620._4_4_ * fVar212;
            auVar55._0_4_ = (float)local_620._0_4_ * fVar206;
            auVar55._8_4_ = fStack_618 * fVar213;
            auVar55._12_4_ = fStack_614 * fVar214;
            auVar55._16_4_ = fStack_610 * fVar215;
            auVar55._20_4_ = fStack_60c * fVar216;
            auVar55._24_4_ = fStack_608 * fVar217;
            auVar55._28_4_ = pfVar3[7];
            auVar143 = vfmadd231ps_fma(auVar53,auVar115,local_660);
            auVar124 = vfmadd231ps_fma(auVar54,auVar115,local_5c0);
            auVar105 = vfmadd231ps_fma(auVar55,local_6a0,auVar115);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar221,local_740);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar221,local_4a0);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_680,auVar221);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar169,local_760);
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar169,local_480);
            auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),local_6e0,auVar169);
            pfVar3 = (float *)(lVar24 + 0x21ae6a0 + lVar100 * 4);
            fVar206 = *pfVar3;
            fVar212 = pfVar3[1];
            fVar213 = pfVar3[2];
            fVar214 = pfVar3[3];
            fVar215 = pfVar3[4];
            fVar216 = pfVar3[5];
            fVar217 = pfVar3[6];
            auVar56._4_4_ = fStack_45c * fVar212;
            auVar56._0_4_ = local_460 * fVar206;
            auVar56._8_4_ = fStack_458 * fVar213;
            auVar56._12_4_ = fStack_454 * fVar214;
            auVar56._16_4_ = fStack_450 * fVar215;
            auVar56._20_4_ = fStack_44c * fVar216;
            auVar56._24_4_ = fStack_448 * fVar217;
            auVar56._28_4_ = uStack_604;
            auVar57._4_4_ = local_140._4_4_ * fVar212;
            auVar57._0_4_ = (float)local_140 * fVar206;
            auVar57._8_4_ = (float)uStack_138 * fVar213;
            auVar57._12_4_ = uStack_138._4_4_ * fVar214;
            auVar57._16_4_ = (float)uStack_130 * fVar215;
            auVar57._20_4_ = uStack_130._4_4_ * fVar216;
            auVar57._24_4_ = (float)uStack_128 * fVar217;
            auVar57._28_4_ = local_6e0._28_4_;
            auVar58._4_4_ = fVar212 * (float)local_620._4_4_;
            auVar58._0_4_ = fVar206 * (float)local_620._0_4_;
            auVar58._8_4_ = fVar213 * fStack_618;
            auVar58._12_4_ = fVar214 * fStack_614;
            auVar58._16_4_ = fVar215 * fStack_610;
            auVar58._20_4_ = fVar216 * fStack_60c;
            auVar58._24_4_ = fVar217 * fStack_608;
            auVar58._28_4_ = pfVar3[7];
            auVar169 = *(undefined1 (*) [32])(lVar24 + 0x21ae21c + lVar100 * 4);
            auVar125 = vfmadd231ps_fma(auVar56,auVar169,local_660);
            auVar156 = vfmadd231ps_fma(auVar57,auVar169,local_5c0);
            auVar165 = vfmadd231ps_fma(auVar58,auVar169,local_6a0);
            auVar169 = *(undefined1 (*) [32])(lVar24 + 0x21add98 + lVar100 * 4);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar169,local_740);
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar169,local_4a0);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar169,local_680);
            auVar169 = *(undefined1 (*) [32])(lVar24 + 0x21ad914 + lVar100 * 4);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar169,local_760);
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar169,local_480);
            auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_6e0,auVar169);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar202._16_4_ = 0x7fffffff;
            auVar202._20_4_ = 0x7fffffff;
            auVar202._24_4_ = 0x7fffffff;
            auVar202._28_4_ = 0x7fffffff;
            auVar169 = vandps_avx(ZEXT1632(auVar143),auVar202);
            auVar221 = vandps_avx(ZEXT1632(auVar124),auVar202);
            auVar221 = vmaxps_avx(auVar169,auVar221);
            auVar169 = vandps_avx(ZEXT1632(auVar105),auVar202);
            auVar169 = vmaxps_avx(auVar221,auVar169);
            auVar169 = vcmpps_avx(auVar169,_local_360,1);
            auVar115 = vblendvps_avx(ZEXT1632(auVar143),auVar109,auVar169);
            auVar133 = vblendvps_avx(ZEXT1632(auVar124),auVar22,auVar169);
            auVar169 = vandps_avx(ZEXT1632(auVar125),auVar202);
            auVar221 = vandps_avx(ZEXT1632(auVar156),auVar202);
            auVar221 = vmaxps_avx(auVar169,auVar221);
            auVar169 = vandps_avx(auVar202,ZEXT1632(auVar165));
            auVar169 = vmaxps_avx(auVar221,auVar169);
            auVar221 = vcmpps_avx(auVar169,_local_360,1);
            auVar169 = vblendvps_avx(ZEXT1632(auVar125),auVar109,auVar221);
            auVar221 = vblendvps_avx(ZEXT1632(auVar156),auVar22,auVar221);
            auVar107 = vfmadd213ps_fma(auVar136,local_6e0,ZEXT1632(auVar107));
            auVar143 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar133,auVar133);
            auVar136 = vrsqrtps_avx(ZEXT1632(auVar143));
            fVar206 = auVar136._0_4_;
            fVar212 = auVar136._4_4_;
            fVar213 = auVar136._8_4_;
            fVar214 = auVar136._12_4_;
            fVar215 = auVar136._16_4_;
            fVar216 = auVar136._20_4_;
            fVar217 = auVar136._24_4_;
            auVar59._4_4_ = fVar212 * fVar212 * fVar212 * auVar143._4_4_ * -0.5;
            auVar59._0_4_ = fVar206 * fVar206 * fVar206 * auVar143._0_4_ * -0.5;
            auVar59._8_4_ = fVar213 * fVar213 * fVar213 * auVar143._8_4_ * -0.5;
            auVar59._12_4_ = fVar214 * fVar214 * fVar214 * auVar143._12_4_ * -0.5;
            auVar59._16_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar59._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
            auVar59._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar59._28_4_ = 0;
            auVar225._8_4_ = 0x3fc00000;
            auVar225._0_8_ = 0x3fc000003fc00000;
            auVar225._12_4_ = 0x3fc00000;
            auVar225._16_4_ = 0x3fc00000;
            auVar225._20_4_ = 0x3fc00000;
            auVar225._24_4_ = 0x3fc00000;
            auVar225._28_4_ = 0x3fc00000;
            auVar143 = vfmadd231ps_fma(auVar59,auVar225,auVar136);
            fVar206 = auVar143._0_4_;
            fVar212 = auVar143._4_4_;
            auVar60._4_4_ = auVar133._4_4_ * fVar212;
            auVar60._0_4_ = auVar133._0_4_ * fVar206;
            fVar213 = auVar143._8_4_;
            auVar60._8_4_ = auVar133._8_4_ * fVar213;
            fVar214 = auVar143._12_4_;
            auVar60._12_4_ = auVar133._12_4_ * fVar214;
            auVar60._16_4_ = auVar133._16_4_ * 0.0;
            auVar60._20_4_ = auVar133._20_4_ * 0.0;
            auVar60._24_4_ = auVar133._24_4_ * 0.0;
            auVar60._28_4_ = auVar136._28_4_;
            auVar61._4_4_ = fVar212 * -auVar115._4_4_;
            auVar61._0_4_ = fVar206 * -auVar115._0_4_;
            auVar61._8_4_ = fVar213 * -auVar115._8_4_;
            auVar61._12_4_ = fVar214 * -auVar115._12_4_;
            auVar61._16_4_ = -auVar115._16_4_ * 0.0;
            auVar61._20_4_ = -auVar115._20_4_ * 0.0;
            auVar61._24_4_ = -auVar115._24_4_ * 0.0;
            auVar61._28_4_ = auVar133._28_4_;
            auVar143 = vfmadd213ps_fma(auVar169,auVar169,ZEXT832(0) << 0x20);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar221,auVar221);
            auVar136 = vrsqrtps_avx(ZEXT1632(auVar143));
            auVar62._28_4_ = uVar102;
            auVar62._0_28_ =
                 ZEXT1628(CONCAT412(fVar214 * 0.0,
                                    CONCAT48(fVar213 * 0.0,CONCAT44(fVar212 * 0.0,fVar206 * 0.0))));
            fVar206 = auVar136._0_4_;
            fVar212 = auVar136._4_4_;
            fVar213 = auVar136._8_4_;
            fVar214 = auVar136._12_4_;
            fVar215 = auVar136._16_4_;
            fVar216 = auVar136._20_4_;
            fVar217 = auVar136._24_4_;
            auVar63._4_4_ = fVar212 * fVar212 * fVar212 * auVar143._4_4_ * -0.5;
            auVar63._0_4_ = fVar206 * fVar206 * fVar206 * auVar143._0_4_ * -0.5;
            auVar63._8_4_ = fVar213 * fVar213 * fVar213 * auVar143._8_4_ * -0.5;
            auVar63._12_4_ = fVar214 * fVar214 * fVar214 * auVar143._12_4_ * -0.5;
            auVar63._16_4_ = fVar215 * fVar215 * fVar215 * -0.0;
            auVar63._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
            auVar63._24_4_ = fVar217 * fVar217 * fVar217 * -0.0;
            auVar63._28_4_ = 0;
            auVar143 = vfmadd231ps_fma(auVar63,auVar225,auVar136);
            fVar206 = auVar143._0_4_;
            fVar212 = auVar143._4_4_;
            auVar64._4_4_ = auVar221._4_4_ * fVar212;
            auVar64._0_4_ = auVar221._0_4_ * fVar206;
            fVar213 = auVar143._8_4_;
            auVar64._8_4_ = auVar221._8_4_ * fVar213;
            fVar214 = auVar143._12_4_;
            auVar64._12_4_ = auVar221._12_4_ * fVar214;
            auVar64._16_4_ = auVar221._16_4_ * 0.0;
            auVar64._20_4_ = auVar221._20_4_ * 0.0;
            auVar64._24_4_ = auVar221._24_4_ * 0.0;
            auVar64._28_4_ = 0;
            auVar65._4_4_ = fVar212 * -auVar169._4_4_;
            auVar65._0_4_ = fVar206 * -auVar169._0_4_;
            auVar65._8_4_ = fVar213 * -auVar169._8_4_;
            auVar65._12_4_ = fVar214 * -auVar169._12_4_;
            auVar65._16_4_ = -auVar169._16_4_ * 0.0;
            auVar65._20_4_ = -auVar169._20_4_ * 0.0;
            auVar65._24_4_ = -auVar169._24_4_ * 0.0;
            auVar65._28_4_ = auVar136._28_4_;
            auVar66._28_4_ = 0xbf000000;
            auVar66._0_28_ =
                 ZEXT1628(CONCAT412(fVar214 * 0.0,
                                    CONCAT48(fVar213 * 0.0,CONCAT44(fVar212 * 0.0,fVar206 * 0.0))));
            auVar143 = vfmadd213ps_fma(auVar60,local_4c0,local_5e0);
            auVar124 = vfmadd213ps_fma(auVar61,local_4c0,local_300);
            auVar105 = vfmadd213ps_fma(auVar62,local_4c0,ZEXT1632(auVar107));
            auVar104 = vfnmadd213ps_fma(auVar60,local_4c0,local_5e0);
            auVar125 = vfmadd213ps_fma(auVar64,ZEXT1632(auVar159),local_4e0);
            auVar123 = vfnmadd213ps_fma(auVar61,local_4c0,local_300);
            auVar136 = ZEXT1632(auVar159);
            auVar156 = vfmadd213ps_fma(auVar65,auVar136,local_600);
            auVar175 = vfnmadd231ps_fma(ZEXT1632(auVar107),local_4c0,auVar62);
            auVar107 = vfmadd213ps_fma(auVar66,auVar136,ZEXT1632(auVar13));
            auVar164 = vfnmadd213ps_fma(auVar64,auVar136,local_4e0);
            auVar174 = vfnmadd213ps_fma(auVar65,auVar136,local_600);
            auVar176 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar159),auVar66);
            auVar136 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar123));
            auVar169 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar175));
            auVar67._4_4_ = auVar136._4_4_ * auVar175._4_4_;
            auVar67._0_4_ = auVar136._0_4_ * auVar175._0_4_;
            auVar67._8_4_ = auVar136._8_4_ * auVar175._8_4_;
            auVar67._12_4_ = auVar136._12_4_ * auVar175._12_4_;
            auVar67._16_4_ = auVar136._16_4_ * 0.0;
            auVar67._20_4_ = auVar136._20_4_ * 0.0;
            auVar67._24_4_ = auVar136._24_4_ * 0.0;
            auVar67._28_4_ = uVar102;
            auVar165 = vfmsub231ps_fma(auVar67,ZEXT1632(auVar123),auVar169);
            auVar68._4_4_ = auVar104._4_4_ * auVar169._4_4_;
            auVar68._0_4_ = auVar104._0_4_ * auVar169._0_4_;
            auVar68._8_4_ = auVar104._8_4_ * auVar169._8_4_;
            auVar68._12_4_ = auVar104._12_4_ * auVar169._12_4_;
            auVar68._16_4_ = auVar169._16_4_ * 0.0;
            auVar68._20_4_ = auVar169._20_4_ * 0.0;
            auVar68._24_4_ = auVar169._24_4_ * 0.0;
            auVar68._28_4_ = auVar169._28_4_;
            auVar195 = ZEXT1632(auVar104);
            auVar169 = vsubps_avx(ZEXT1632(auVar125),auVar195);
            auVar154 = ZEXT1632(auVar175);
            auVar13 = vfmsub231ps_fma(auVar68,auVar154,auVar169);
            auVar69._4_4_ = auVar123._4_4_ * auVar169._4_4_;
            auVar69._0_4_ = auVar123._0_4_ * auVar169._0_4_;
            auVar69._8_4_ = auVar123._8_4_ * auVar169._8_4_;
            auVar69._12_4_ = auVar123._12_4_ * auVar169._12_4_;
            auVar69._16_4_ = auVar169._16_4_ * 0.0;
            auVar69._20_4_ = auVar169._20_4_ * 0.0;
            auVar69._24_4_ = auVar169._24_4_ * 0.0;
            auVar69._28_4_ = auVar169._28_4_;
            auVar104 = vfmsub231ps_fma(auVar69,auVar195,auVar136);
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar165));
            auVar23 = vcmpps_avx(ZEXT1632(auVar13),ZEXT832(0) << 0x20,2);
            auVar136 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar143),auVar23);
            auVar169 = vblendvps_avx(ZEXT1632(auVar174),ZEXT1632(auVar124),auVar23);
            auVar221 = vblendvps_avx(ZEXT1632(auVar176),ZEXT1632(auVar105),auVar23);
            auVar220 = ZEXT3264(auVar221);
            auVar115 = vblendvps_avx(auVar195,ZEXT1632(auVar125),auVar23);
            auVar133 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar156),auVar23);
            auVar7 = vblendvps_avx(auVar154,ZEXT1632(auVar107),auVar23);
            auVar195 = vblendvps_avx(ZEXT1632(auVar125),auVar195,auVar23);
            auVar109 = vblendvps_avx(ZEXT1632(auVar156),ZEXT1632(auVar123),auVar23);
            auVar13 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            auVar154 = vblendvps_avx(ZEXT1632(auVar107),auVar154,auVar23);
            auVar195 = vsubps_avx(auVar195,auVar136);
            auVar109 = vsubps_avx(auVar109,auVar169);
            auVar21 = vsubps_avx(auVar154,auVar221);
            auVar110 = vsubps_avx(auVar136,auVar115);
            auVar128 = vsubps_avx(auVar169,auVar133);
            auVar210 = ZEXT3264(auVar128);
            auVar129 = vsubps_avx(auVar221,auVar7);
            auVar182._0_4_ = auVar21._0_4_ * auVar136._0_4_;
            auVar182._4_4_ = auVar21._4_4_ * auVar136._4_4_;
            auVar182._8_4_ = auVar21._8_4_ * auVar136._8_4_;
            auVar182._12_4_ = auVar21._12_4_ * auVar136._12_4_;
            auVar182._16_4_ = auVar21._16_4_ * auVar136._16_4_;
            auVar182._20_4_ = auVar21._20_4_ * auVar136._20_4_;
            auVar182._24_4_ = auVar21._24_4_ * auVar136._24_4_;
            auVar182._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar182,auVar221,auVar195);
            auVar70._4_4_ = auVar195._4_4_ * auVar169._4_4_;
            auVar70._0_4_ = auVar195._0_4_ * auVar169._0_4_;
            auVar70._8_4_ = auVar195._8_4_ * auVar169._8_4_;
            auVar70._12_4_ = auVar195._12_4_ * auVar169._12_4_;
            auVar70._16_4_ = auVar195._16_4_ * auVar169._16_4_;
            auVar70._20_4_ = auVar195._20_4_ * auVar169._20_4_;
            auVar70._24_4_ = auVar195._24_4_ * auVar169._24_4_;
            auVar70._28_4_ = auVar154._28_4_;
            auVar143 = vfmsub231ps_fma(auVar70,auVar136,auVar109);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar143),ZEXT832(0) << 0x20,ZEXT1632(auVar107));
            auVar183._0_4_ = auVar109._0_4_ * auVar221._0_4_;
            auVar183._4_4_ = auVar109._4_4_ * auVar221._4_4_;
            auVar183._8_4_ = auVar109._8_4_ * auVar221._8_4_;
            auVar183._12_4_ = auVar109._12_4_ * auVar221._12_4_;
            auVar183._16_4_ = auVar109._16_4_ * auVar221._16_4_;
            auVar183._20_4_ = auVar109._20_4_ * auVar221._20_4_;
            auVar183._24_4_ = auVar109._24_4_ * auVar221._24_4_;
            auVar183._28_4_ = 0;
            auVar143 = vfmsub231ps_fma(auVar183,auVar169,auVar21);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar143));
            auVar184._0_4_ = auVar129._0_4_ * auVar115._0_4_;
            auVar184._4_4_ = auVar129._4_4_ * auVar115._4_4_;
            auVar184._8_4_ = auVar129._8_4_ * auVar115._8_4_;
            auVar184._12_4_ = auVar129._12_4_ * auVar115._12_4_;
            auVar184._16_4_ = auVar129._16_4_ * auVar115._16_4_;
            auVar184._20_4_ = auVar129._20_4_ * auVar115._20_4_;
            auVar184._24_4_ = auVar129._24_4_ * auVar115._24_4_;
            auVar184._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar184,auVar110,auVar7);
            auVar71._4_4_ = auVar128._4_4_ * auVar7._4_4_;
            auVar71._0_4_ = auVar128._0_4_ * auVar7._0_4_;
            auVar71._8_4_ = auVar128._8_4_ * auVar7._8_4_;
            auVar71._12_4_ = auVar128._12_4_ * auVar7._12_4_;
            auVar71._16_4_ = auVar128._16_4_ * auVar7._16_4_;
            auVar71._20_4_ = auVar128._20_4_ * auVar7._20_4_;
            auVar71._24_4_ = auVar128._24_4_ * auVar7._24_4_;
            auVar71._28_4_ = auVar7._28_4_;
            auVar124 = vfmsub231ps_fma(auVar71,auVar133,auVar129);
            auVar72._4_4_ = auVar110._4_4_ * auVar133._4_4_;
            auVar72._0_4_ = auVar110._0_4_ * auVar133._0_4_;
            auVar72._8_4_ = auVar110._8_4_ * auVar133._8_4_;
            auVar72._12_4_ = auVar110._12_4_ * auVar133._12_4_;
            auVar72._16_4_ = auVar110._16_4_ * auVar133._16_4_;
            auVar72._20_4_ = auVar110._20_4_ * auVar133._20_4_;
            auVar72._24_4_ = auVar110._24_4_ * auVar133._24_4_;
            auVar72._28_4_ = auVar133._28_4_;
            auVar105 = vfmsub231ps_fma(auVar72,auVar128,auVar115);
            auVar133 = ZEXT832(0) << 0x20;
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar133,ZEXT1632(auVar107));
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar133,ZEXT1632(auVar124));
            auVar115 = vmaxps_avx(ZEXT1632(auVar143),ZEXT1632(auVar124));
            auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
            auVar107 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
            auVar13 = vpand_avx(auVar107,auVar13);
            auVar115 = vpmovsxwd_avx2(auVar13);
            if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0x7f,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar115 >> 0xbf,0) == '\0') &&
                (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar115[0x1f]) {
LAB_0159b977:
              auVar162._8_8_ = local_5a0[1]._8_8_;
              auVar162._0_8_ = local_5a0[1]._0_8_;
              auVar162._16_8_ = local_5a0[1]._16_8_;
              auVar162._24_8_ = local_5a0[1]._24_8_;
            }
            else {
              auVar73._4_4_ = auVar109._4_4_ * auVar129._4_4_;
              auVar73._0_4_ = auVar109._0_4_ * auVar129._0_4_;
              auVar73._8_4_ = auVar109._8_4_ * auVar129._8_4_;
              auVar73._12_4_ = auVar109._12_4_ * auVar129._12_4_;
              auVar73._16_4_ = auVar109._16_4_ * auVar129._16_4_;
              auVar73._20_4_ = auVar109._20_4_ * auVar129._20_4_;
              auVar73._24_4_ = auVar109._24_4_ * auVar129._24_4_;
              auVar73._28_4_ = auVar115._28_4_;
              auVar156 = vfmsub231ps_fma(auVar73,auVar128,auVar21);
              auVar188._0_4_ = auVar110._0_4_ * auVar21._0_4_;
              auVar188._4_4_ = auVar110._4_4_ * auVar21._4_4_;
              auVar188._8_4_ = auVar110._8_4_ * auVar21._8_4_;
              auVar188._12_4_ = auVar110._12_4_ * auVar21._12_4_;
              auVar188._16_4_ = auVar110._16_4_ * auVar21._16_4_;
              auVar188._20_4_ = auVar110._20_4_ * auVar21._20_4_;
              auVar188._24_4_ = auVar110._24_4_ * auVar21._24_4_;
              auVar188._28_4_ = 0;
              auVar125 = vfmsub231ps_fma(auVar188,auVar195,auVar129);
              auVar74._4_4_ = auVar195._4_4_ * auVar128._4_4_;
              auVar74._0_4_ = auVar195._0_4_ * auVar128._0_4_;
              auVar74._8_4_ = auVar195._8_4_ * auVar128._8_4_;
              auVar74._12_4_ = auVar195._12_4_ * auVar128._12_4_;
              auVar74._16_4_ = auVar195._16_4_ * auVar128._16_4_;
              auVar74._20_4_ = auVar195._20_4_ * auVar128._20_4_;
              auVar74._24_4_ = auVar195._24_4_ * auVar128._24_4_;
              auVar74._28_4_ = auVar128._28_4_;
              auVar165 = vfmsub231ps_fma(auVar74,auVar110,auVar109);
              auVar210 = ZEXT1664(auVar165);
              auVar107 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar125),ZEXT1632(auVar165));
              auVar105 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar156),auVar133);
              auVar115 = vrcpps_avx(ZEXT1632(auVar105));
              auVar219._8_4_ = 0x3f800000;
              auVar219._0_8_ = 0x3f8000003f800000;
              auVar219._12_4_ = 0x3f800000;
              auVar219._16_4_ = 0x3f800000;
              auVar219._20_4_ = 0x3f800000;
              auVar219._24_4_ = 0x3f800000;
              auVar219._28_4_ = 0x3f800000;
              auVar220 = ZEXT3264(auVar219);
              auVar107 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar105),auVar219);
              auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar115,auVar115);
              auVar75._4_4_ = auVar165._4_4_ * auVar221._4_4_;
              auVar75._0_4_ = auVar165._0_4_ * auVar221._0_4_;
              auVar75._8_4_ = auVar165._8_4_ * auVar221._8_4_;
              auVar75._12_4_ = auVar165._12_4_ * auVar221._12_4_;
              auVar75._16_4_ = auVar221._16_4_ * 0.0;
              auVar75._20_4_ = auVar221._20_4_ * 0.0;
              auVar75._24_4_ = auVar221._24_4_ * 0.0;
              auVar75._28_4_ = auVar21._28_4_;
              auVar125 = vfmadd231ps_fma(auVar75,auVar169,ZEXT1632(auVar125));
              auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT1632(auVar156),auVar136);
              fVar206 = auVar107._0_4_;
              fVar212 = auVar107._4_4_;
              fVar213 = auVar107._8_4_;
              fVar214 = auVar107._12_4_;
              auVar115 = ZEXT1632(CONCAT412(fVar214 * auVar125._12_4_,
                                            CONCAT48(fVar213 * auVar125._8_4_,
                                                     CONCAT44(fVar212 * auVar125._4_4_,
                                                              fVar206 * auVar125._0_4_))));
              uVar102 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar161._4_4_ = uVar102;
              auVar161._0_4_ = uVar102;
              auVar161._8_4_ = uVar102;
              auVar161._12_4_ = uVar102;
              auVar161._16_4_ = uVar102;
              auVar161._20_4_ = uVar102;
              auVar161._24_4_ = uVar102;
              auVar161._28_4_ = uVar102;
              auVar92._4_4_ = uStack_55c;
              auVar92._0_4_ = local_560;
              auVar92._8_4_ = uStack_558;
              auVar92._12_4_ = uStack_554;
              auVar92._16_4_ = uStack_550;
              auVar92._20_4_ = uStack_54c;
              auVar92._24_4_ = uStack_548;
              auVar92._28_4_ = uStack_544;
              auVar136 = vcmpps_avx(auVar92,auVar115,2);
              auVar169 = vcmpps_avx(auVar115,auVar161,2);
              auVar136 = vandps_avx(auVar169,auVar136);
              auVar107 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
              auVar13 = vpand_avx(auVar13,auVar107);
              auVar136 = vpmovsxwd_avx2(auVar13);
              if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar136 >> 0x7f,0) == '\0') &&
                    (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar136 >> 0xbf,0) == '\0') &&
                  (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar136[0x1f]) goto LAB_0159b977;
              auVar136 = vcmpps_avx(ZEXT1632(auVar105),ZEXT832(0) << 0x20,4);
              auVar107 = vpackssdw_avx(auVar136._0_16_,auVar136._16_16_);
              auVar13 = vpand_avx(auVar13,auVar107);
              auVar136 = vpmovsxwd_avx2(auVar13);
              auVar162._8_8_ = local_5a0[1]._8_8_;
              auVar162._0_8_ = local_5a0[1]._0_8_;
              auVar162._16_8_ = local_5a0[1]._16_8_;
              auVar162._24_8_ = local_5a0[1]._24_8_;
              if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar136 >> 0x7f,0) != '\0') ||
                    (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar136 >> 0xbf,0) != '\0') ||
                  (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar136[0x1f] < '\0') {
                auVar133 = ZEXT1632(CONCAT412(fVar214 * auVar143._12_4_,
                                              CONCAT48(fVar213 * auVar143._8_4_,
                                                       CONCAT44(fVar212 * auVar143._4_4_,
                                                                fVar206 * auVar143._0_4_))));
                auVar76._28_4_ = SUB84(local_5a0[1]._24_8_,4);
                auVar76._0_28_ =
                     ZEXT1628(CONCAT412(fVar214 * auVar124._12_4_,
                                        CONCAT48(fVar213 * auVar124._8_4_,
                                                 CONCAT44(fVar212 * auVar124._4_4_,
                                                          fVar206 * auVar124._0_4_))));
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar169 = vsubps_avx(auVar196,auVar133);
                local_100 = vblendvps_avx(auVar169,auVar133,auVar23);
                auVar169 = vsubps_avx(auVar196,auVar76);
                local_3a0 = vblendvps_avx(auVar169,auVar76,auVar23);
                auVar162 = auVar136;
                local_540 = auVar115;
              }
            }
            auVar226 = ZEXT3264(local_760);
            if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar162 >> 0x7f,0) == '\0') &&
                  (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0xbf,0) == '\0') &&
                (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar162[0x1f]) {
              auVar141 = ZEXT3264(local_660);
              auVar192 = ZEXT3264(local_740);
            }
            else {
              auVar136 = vsubps_avx(ZEXT1632(auVar159),local_4c0);
              auVar13 = vfmadd213ps_fma(auVar136,local_100,local_4c0);
              fVar206 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar77._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar206;
              auVar77._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar206;
              auVar77._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar206;
              auVar77._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar206;
              auVar77._16_4_ = fVar206 * 0.0;
              auVar77._20_4_ = fVar206 * 0.0;
              auVar77._24_4_ = fVar206 * 0.0;
              auVar77._28_4_ = fVar206;
              auVar136 = vcmpps_avx(local_540,auVar77,6);
              auVar169 = auVar162 & auVar136;
              auVar192 = ZEXT3264(local_740);
              if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar169 >> 0x7f,0) != '\0') ||
                    (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar169 >> 0xbf,0) != '\0') ||
                  (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar169[0x1f] < '\0') {
                auVar137._8_4_ = 0xbf800000;
                auVar137._0_8_ = 0xbf800000bf800000;
                auVar137._12_4_ = 0xbf800000;
                auVar137._16_4_ = 0xbf800000;
                auVar137._20_4_ = 0xbf800000;
                auVar137._24_4_ = 0xbf800000;
                auVar137._28_4_ = 0xbf800000;
                auVar155._8_4_ = 0x40000000;
                auVar155._0_8_ = 0x4000000040000000;
                auVar155._12_4_ = 0x40000000;
                auVar155._16_4_ = 0x40000000;
                auVar155._20_4_ = 0x40000000;
                auVar155._24_4_ = 0x40000000;
                auVar155._28_4_ = 0x40000000;
                auVar13 = vfmadd213ps_fma(local_3a0,auVar155,auVar137);
                local_2a0 = local_100;
                local_3a0 = ZEXT1632(auVar13);
                auVar169 = local_3a0;
                local_280 = ZEXT1632(auVar13);
                local_260 = local_540;
                local_23c = iVar9;
                local_230 = uVar90;
                uStack_228 = uVar91;
                local_220 = local_7a0;
                uStack_218 = uStack_798;
                local_210 = local_7b0;
                uStack_208 = uStack_7a8;
                local_200 = local_7c0;
                uStack_1f8 = uStack_7b8;
                pGVar10 = (context->scene->geometries).items[(uint)local_7e0._4_4_].ptr;
                local_3a0 = auVar169;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5a0[0] = vandps_avx(auVar136,auVar162);
                  fVar206 = (float)local_240;
                  local_1c0[0] = (fVar206 + local_100._0_4_ + 0.0) * local_120;
                  local_1c0[1] = (fVar206 + local_100._4_4_ + 1.0) * fStack_11c;
                  local_1c0[2] = (fVar206 + local_100._8_4_ + 2.0) * fStack_118;
                  local_1c0[3] = (fVar206 + local_100._12_4_ + 3.0) * fStack_114;
                  fStack_1b0 = (fVar206 + local_100._16_4_ + 4.0) * fStack_110;
                  fStack_1ac = (fVar206 + local_100._20_4_ + 5.0) * fStack_10c;
                  fStack_1a8 = (fVar206 + local_100._24_4_ + 6.0) * fStack_108;
                  fStack_1a4 = fVar206 + local_100._28_4_ + 7.0;
                  local_3a0._0_8_ = auVar13._0_8_;
                  local_3a0._8_8_ = auVar13._8_8_;
                  local_1a0 = local_3a0._0_8_;
                  uStack_198 = local_3a0._8_8_;
                  uStack_190 = 0;
                  uStack_188 = 0;
                  local_180 = local_540;
                  auVar138._8_4_ = 0x7f800000;
                  auVar138._0_8_ = 0x7f8000007f800000;
                  auVar138._12_4_ = 0x7f800000;
                  auVar138._16_4_ = 0x7f800000;
                  auVar138._20_4_ = 0x7f800000;
                  auVar138._24_4_ = 0x7f800000;
                  auVar138._28_4_ = 0x7f800000;
                  auVar136 = vblendvps_avx(auVar138,local_540,local_5a0[0]);
                  auVar169 = vshufps_avx(auVar136,auVar136,0xb1);
                  auVar169 = vminps_avx(auVar136,auVar169);
                  auVar115 = vshufpd_avx(auVar169,auVar169,5);
                  auVar169 = vminps_avx(auVar169,auVar115);
                  auVar115 = vpermpd_avx2(auVar169,0x4e);
                  auVar169 = vminps_avx(auVar169,auVar115);
                  auVar169 = vcmpps_avx(auVar136,auVar169,0);
                  auVar115 = local_5a0[0] & auVar169;
                  auVar136 = local_5a0[0];
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0x7f,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0xbf,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar115[0x1f] < '\0') {
                    auVar136 = vandps_avx(auVar169,local_5a0[0]);
                  }
                  uVar94 = vmovmskps_avx(auVar136);
                  uVar96 = 0;
                  for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                    uVar96 = uVar96 + 1;
                  }
                  uVar95 = (ulong)uVar96;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar206 = local_1c0[uVar95];
                    uVar102 = *(undefined4 *)((long)&local_1a0 + uVar95 * 4);
                    fVar213 = 1.0 - fVar206;
                    fVar212 = fVar213 * fVar213 * -3.0;
                    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                              ZEXT416((uint)(fVar206 * fVar213)),ZEXT416(0xc0000000)
                                             );
                    auVar159 = vfmsub132ss_fma(ZEXT416((uint)(fVar206 * fVar213)),
                                               ZEXT416((uint)(fVar206 * fVar206)),
                                               ZEXT416(0x40000000));
                    fVar213 = auVar13._0_4_ * 3.0;
                    fVar214 = auVar159._0_4_ * 3.0;
                    fVar215 = fVar206 * fVar206 * 3.0;
                    auVar178._0_4_ = fVar215 * fVar118;
                    auVar178._4_4_ = fVar215 * fVar119;
                    auVar178._8_4_ = fVar215 * fVar120;
                    auVar178._12_4_ = fVar215 * fVar15;
                    auVar146._4_4_ = fVar214;
                    auVar146._0_4_ = fVar214;
                    auVar146._8_4_ = fVar214;
                    auVar146._12_4_ = fVar214;
                    auVar13 = vfmadd132ps_fma(auVar146,auVar178,auVar18);
                    auVar158._4_4_ = fVar213;
                    auVar158._0_4_ = fVar213;
                    auVar158._8_4_ = fVar213;
                    auVar158._12_4_ = fVar213;
                    auVar13 = vfmadd132ps_fma(auVar158,auVar13,auVar17);
                    auVar147._4_4_ = fVar212;
                    auVar147._0_4_ = fVar212;
                    auVar147._8_4_ = fVar212;
                    auVar147._12_4_ = fVar212;
                    auVar13 = vfmadd132ps_fma(auVar147,auVar13,auVar14);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar95 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar13._0_4_;
                    uVar197 = vextractps_avx(auVar13,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar197;
                    uVar197 = vextractps_avx(auVar13,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar197;
                    *(float *)(ray + k * 4 + 0xf0) = fVar206;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar102;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x120) = local_7e0._4_4_;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_600 = ZEXT1632(CONCAT88(auVar106._8_8_,lVar100));
                    auVar13 = *local_6a8;
                    auStack_830 = auVar221._16_16_;
                    local_840 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    _local_500 = auVar22;
                    while( true ) {
                      auVar136 = _local_840;
                      local_400 = local_1c0[uVar95];
                      local_3f0 = *(undefined4 *)((long)&local_1a0 + uVar95 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar95 * 4);
                      fVar213 = 1.0 - local_400;
                      auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                                 ZEXT416((uint)(local_400 * fVar213)),
                                                 ZEXT416(0xc0000000));
                      auVar159 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar213)),
                                                 ZEXT416((uint)(local_400 * local_400)),
                                                 ZEXT416(0x40000000));
                      fVar206 = auVar159._0_4_ * 3.0;
                      fVar212 = local_400 * local_400 * 3.0;
                      auVar179._0_4_ = fVar212 * fVar118;
                      auVar179._4_4_ = fVar212 * fVar119;
                      auVar179._8_4_ = fVar212 * fVar120;
                      auVar179._12_4_ = fVar212 * fVar15;
                      auVar148._4_4_ = fVar206;
                      auVar148._0_4_ = fVar206;
                      auVar148._8_4_ = fVar206;
                      auVar148._12_4_ = fVar206;
                      auVar159 = vfmadd132ps_fma(auVar148,auVar179,auVar18);
                      fVar206 = auVar107._0_4_ * 3.0;
                      auVar167._4_4_ = fVar206;
                      auVar167._0_4_ = fVar206;
                      auVar167._8_4_ = fVar206;
                      auVar167._12_4_ = fVar206;
                      auVar159 = vfmadd132ps_fma(auVar167,auVar159,auVar17);
                      fVar206 = fVar213 * fVar213 * -3.0;
                      local_710.context = context->user;
                      auVar149._4_4_ = fVar206;
                      auVar149._0_4_ = fVar206;
                      auVar149._8_4_ = fVar206;
                      auVar149._12_4_ = fVar206;
                      auVar107 = vfmadd132ps_fma(auVar149,auVar159,auVar16);
                      local_430 = auVar107._0_4_;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      auVar159 = vshufps_avx(auVar107,auVar107,0x55);
                      local_420 = auVar159;
                      local_410 = vshufps_avx(auVar107,auVar107,0xaa);
                      fStack_3fc = local_400;
                      fStack_3f8 = local_400;
                      fStack_3f4 = local_400;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      local_3e0 = CONCAT44(uStack_2cc,local_2d0);
                      uStack_3d8 = CONCAT44(uStack_2c4,uStack_2c8);
                      local_3d0 = _local_630;
                      vpcmpeqd_avx2(ZEXT1632(_local_630),ZEXT1632(_local_630));
                      uStack_3bc = (local_710.context)->instID[0];
                      local_3c0 = uStack_3bc;
                      uStack_3b8 = uStack_3bc;
                      uStack_3b4 = uStack_3bc;
                      uStack_3b0 = (local_710.context)->instPrimID[0];
                      uStack_3ac = uStack_3b0;
                      uStack_3a8 = uStack_3b0;
                      uStack_3a4 = uStack_3b0;
                      local_710.valid = (int *)local_790;
                      local_710.geometryUserPtr = pGVar10->userPtr;
                      local_710.hit = (RTCHitN *)&local_430;
                      local_710.N = 4;
                      local_790 = auVar13;
                      local_710.ray = (RTCRayN *)ray;
                      if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar210 = ZEXT1664(auVar210._0_16_);
                        auVar220 = ZEXT1664(auVar220._0_16_);
                        (*pGVar10->intersectionFilterN)(&local_710);
                      }
                      if (local_790 == (undefined1  [16])0x0) {
                        auVar159 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar159 = auVar159 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar210 = ZEXT1664(auVar210._0_16_);
                          auVar220 = ZEXT1664(auVar220._0_16_);
                          (*p_Var11)(&local_710);
                        }
                        auVar107 = vpcmpeqd_avx(local_790,_DAT_01f7aa10);
                        auVar106 = vpcmpeqd_avx(auVar159,auVar159);
                        auVar159 = auVar107 ^ auVar106;
                        if (local_790 != (undefined1  [16])0x0) {
                          auVar107 = auVar107 ^ auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])local_710.hit);
                          *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x10));
                          *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x20));
                          *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x30));
                          *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x40));
                          *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x50));
                          *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x60));
                          *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar106;
                          auVar106 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x70));
                          *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar106;
                          auVar107 = vmaskmovps_avx(auVar107,*(undefined1 (*) [16])
                                                              (local_710.hit + 0x80));
                          *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar107;
                        }
                      }
                      auVar169 = local_540;
                      auVar126._8_8_ = 0x100000001;
                      auVar126._0_8_ = 0x100000001;
                      if ((auVar126 & auVar159) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                      }
                      else {
                        local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_840._4_4_ = 0;
                        local_840._8_4_ = 0;
                        local_840._12_4_ = 0;
                      }
                      *(undefined4 *)(local_5a0[0] + uVar95 * 4) = 0;
                      auStack_830 = auVar136._16_16_;
                      auVar116._4_4_ = local_840._0_4_;
                      auVar116._0_4_ = local_840._0_4_;
                      auVar116._8_4_ = local_840._0_4_;
                      auVar116._12_4_ = local_840._0_4_;
                      auVar116._16_4_ = local_840._0_4_;
                      auVar116._20_4_ = local_840._0_4_;
                      auVar116._24_4_ = local_840._0_4_;
                      auVar116._28_4_ = local_840._0_4_;
                      auVar221 = vcmpps_avx(auVar169,auVar116,2);
                      auVar136 = vandps_avx(auVar221,local_5a0[0]);
                      local_5a0[0] = local_5a0[0] & auVar221;
                      if ((((((((local_5a0[0] >> 0x1f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0 &&
                               (local_5a0[0] >> 0x3f & (undefined1  [32])0x1) ==
                               (undefined1  [32])0x0) &&
                              (local_5a0[0] >> 0x5f & (undefined1  [32])0x1) ==
                              (undefined1  [32])0x0) && SUB321(local_5a0[0] >> 0x7f,0) == '\0') &&
                            (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                           && SUB321(local_5a0[0] >> 0xbf,0) == '\0') &&
                          (local_5a0[0] & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                          && -1 < local_5a0[0][0x1f]) break;
                      auVar139._8_4_ = 0x7f800000;
                      auVar139._0_8_ = 0x7f8000007f800000;
                      auVar139._12_4_ = 0x7f800000;
                      auVar139._16_4_ = 0x7f800000;
                      auVar139._20_4_ = 0x7f800000;
                      auVar139._24_4_ = 0x7f800000;
                      auVar139._28_4_ = 0x7f800000;
                      auVar169 = vblendvps_avx(auVar139,auVar169,auVar136);
                      auVar221 = vshufps_avx(auVar169,auVar169,0xb1);
                      auVar221 = vminps_avx(auVar169,auVar221);
                      auVar115 = vshufpd_avx(auVar221,auVar221,5);
                      auVar221 = vminps_avx(auVar221,auVar115);
                      auVar115 = vpermpd_avx2(auVar221,0x4e);
                      auVar221 = vminps_avx(auVar221,auVar115);
                      auVar221 = vcmpps_avx(auVar169,auVar221,0);
                      auVar115 = auVar136 & auVar221;
                      auVar169 = auVar136;
                      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar115 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar115 >> 0x7f,0) != '\0') ||
                            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar115 >> 0xbf,0) != '\0') ||
                          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar115[0x1f] < '\0') {
                        auVar169 = vandps_avx(auVar221,auVar136);
                      }
                      uVar94 = vmovmskps_avx(auVar169);
                      uVar96 = 0;
                      for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                        uVar96 = uVar96 + 1;
                      }
                      uVar95 = (ulong)uVar96;
                      local_5a0[0] = auVar136;
                    }
                    auVar192 = ZEXT3264(local_740);
                    auVar226 = ZEXT3264(local_760);
                    pLVar98 = local_778;
                    pre = local_770;
                    pPVar99 = local_768;
                    lVar100 = local_600._0_8_;
                  }
                }
              }
              auVar141 = ZEXT3264(local_660);
            }
          }
          lVar100 = lVar100 + 8;
          auVar163 = ZEXT3264(local_5c0);
        } while ((int)lVar100 < iVar9);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar108._4_4_ = uVar4;
      auVar108._0_4_ = uVar4;
      auVar108._8_4_ = uVar4;
      auVar108._12_4_ = uVar4;
      auVar13 = vcmpps_avx(local_2c0,auVar108,2);
      uVar96 = vmovmskps_avx(auVar13);
      uVar96 = (uint)uVar101 & uVar96;
    } while (uVar96 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }